

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiIntersectorK<8,8>::
     occluded_h<embree::avx512::SweepCurve1IntersectorK<embree::HermiteCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float fVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  float fVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  long lVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [12];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  byte bVar58;
  byte bVar59;
  byte bVar60;
  byte bVar61;
  ulong uVar62;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  byte bVar63;
  byte bVar64;
  ulong uVar65;
  byte bVar66;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined8 in_R11;
  ulong uVar67;
  bool bVar68;
  undefined1 uVar69;
  undefined1 uVar70;
  ulong uVar71;
  uint uVar72;
  undefined1 auVar84 [16];
  uint uVar134;
  uint uVar135;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  uint uVar136;
  uint uVar140;
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar133 [32];
  float pp;
  float fVar141;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  float fVar155;
  undefined4 uVar156;
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar168;
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  undefined1 auVar164 [32];
  undefined1 auVar157 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  float fVar174;
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  float fVar175;
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  float fVar199;
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar205 [16];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar211 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar227 [16];
  undefined1 auVar229 [32];
  undefined1 auVar226 [16];
  undefined1 auVar230 [32];
  undefined1 auVar228 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  undefined1 auVar240 [32];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar241 [64];
  undefined1 auVar242 [32];
  undefined1 auVar243 [64];
  float fVar244;
  undefined1 auVar245 [28];
  undefined1 auVar246 [64];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  float fVar250;
  undefined1 auVar249 [64];
  undefined1 auVar251 [32];
  undefined1 auVar252 [64];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_ab4;
  RTCFilterFunctionNArguments local_8b0;
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_490 [16];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  RTCHitN local_400 [32];
  undefined1 local_3e0 [32];
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined1 local_340 [32];
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint uStack_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar132 [32];
  
  uVar62 = (ulong)(byte)prim[1];
  fVar1 = *(float *)(prim + uVar62 * 0x19 + 0x12);
  auVar75 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar75 = vinsertps_avx(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar79 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar80 = vsubps_avx(auVar75,*(undefined1 (*) [16])(prim + uVar62 * 0x19 + 6));
  fVar199 = fVar1 * auVar80._0_4_;
  fVar141 = fVar1 * auVar79._0_4_;
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar62 * 4 + 6);
  auVar91 = vpmovsxbd_avx2(auVar75);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar62 * 5 + 6);
  auVar89 = vpmovsxbd_avx2(auVar15);
  auVar73._8_8_ = 0;
  auVar73._0_8_ = *(ulong *)(prim + uVar62 * 6 + 6);
  auVar90 = vpmovsxbd_avx2(auVar73);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar62 * 0xb + 6);
  auVar92 = vpmovsxbd_avx2(auVar76);
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + uVar62 * 0xc + 6);
  auVar93 = vpmovsxbd_avx2(auVar2);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar62 * 0xd + 6);
  auVar94 = vpmovsxbd_avx2(auVar77);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar62 * 0x12 + 6);
  auVar95 = vpmovsxbd_avx2(auVar83);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar62 * 0x13 + 6);
  auVar98 = vpmovsxbd_avx2(auVar74);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar62 * 0x14 + 6);
  auVar87 = vpmovsxbd_avx2(auVar78);
  auVar96 = vcvtdq2ps_avx(auVar98);
  auVar97 = vcvtdq2ps_avx(auVar87);
  auVar106._4_4_ = fVar141;
  auVar106._0_4_ = fVar141;
  auVar106._8_4_ = fVar141;
  auVar106._12_4_ = fVar141;
  auVar106._16_4_ = fVar141;
  auVar106._20_4_ = fVar141;
  auVar106._24_4_ = fVar141;
  auVar106._28_4_ = fVar141;
  auVar108._8_4_ = 1;
  auVar108._0_8_ = 0x100000001;
  auVar108._12_4_ = 1;
  auVar108._16_4_ = 1;
  auVar108._20_4_ = 1;
  auVar108._24_4_ = 1;
  auVar108._28_4_ = 1;
  auVar99 = ZEXT1632(CONCAT412(fVar1 * auVar79._12_4_,
                               CONCAT48(fVar1 * auVar79._8_4_,
                                        CONCAT44(fVar1 * auVar79._4_4_,fVar141))));
  auVar88 = vpermps_avx2(auVar108,auVar99);
  auVar85 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar86 = vpermps_avx512vl(auVar85,auVar99);
  fVar141 = auVar86._0_4_;
  fVar155 = auVar86._4_4_;
  auVar99._4_4_ = fVar155 * auVar90._4_4_;
  auVar99._0_4_ = fVar141 * auVar90._0_4_;
  fVar168 = auVar86._8_4_;
  auVar99._8_4_ = fVar168 * auVar90._8_4_;
  fVar169 = auVar86._12_4_;
  auVar99._12_4_ = fVar169 * auVar90._12_4_;
  fVar170 = auVar86._16_4_;
  auVar99._16_4_ = fVar170 * auVar90._16_4_;
  fVar172 = auVar86._20_4_;
  auVar99._20_4_ = fVar172 * auVar90._20_4_;
  fVar171 = auVar86._24_4_;
  auVar99._24_4_ = fVar171 * auVar90._24_4_;
  auVar99._28_4_ = auVar87._28_4_;
  auVar87._4_4_ = auVar94._4_4_ * fVar155;
  auVar87._0_4_ = auVar94._0_4_ * fVar141;
  auVar87._8_4_ = auVar94._8_4_ * fVar168;
  auVar87._12_4_ = auVar94._12_4_ * fVar169;
  auVar87._16_4_ = auVar94._16_4_ * fVar170;
  auVar87._20_4_ = auVar94._20_4_ * fVar172;
  auVar87._24_4_ = auVar94._24_4_ * fVar171;
  auVar87._28_4_ = auVar98._28_4_;
  auVar98._4_4_ = auVar97._4_4_ * fVar155;
  auVar98._0_4_ = auVar97._0_4_ * fVar141;
  auVar98._8_4_ = auVar97._8_4_ * fVar168;
  auVar98._12_4_ = auVar97._12_4_ * fVar169;
  auVar98._16_4_ = auVar97._16_4_ * fVar170;
  auVar98._20_4_ = auVar97._20_4_ * fVar172;
  auVar98._24_4_ = auVar97._24_4_ * fVar171;
  auVar98._28_4_ = auVar86._28_4_;
  auVar75 = vfmadd231ps_fma(auVar99,auVar88,auVar89);
  auVar15 = vfmadd231ps_fma(auVar87,auVar88,auVar93);
  auVar73 = vfmadd231ps_fma(auVar98,auVar96,auVar88);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar106,auVar91);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar106,auVar92);
  auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),auVar95,auVar106);
  auVar107._4_4_ = fVar199;
  auVar107._0_4_ = fVar199;
  auVar107._8_4_ = fVar199;
  auVar107._12_4_ = fVar199;
  auVar107._16_4_ = fVar199;
  auVar107._20_4_ = fVar199;
  auVar107._24_4_ = fVar199;
  auVar107._28_4_ = fVar199;
  auVar87 = ZEXT1632(CONCAT412(fVar1 * auVar80._12_4_,
                               CONCAT48(fVar1 * auVar80._8_4_,
                                        CONCAT44(fVar1 * auVar80._4_4_,fVar199))));
  auVar98 = vpermps_avx2(auVar108,auVar87);
  auVar87 = vpermps_avx512vl(auVar85,auVar87);
  auVar88 = vmulps_avx512vl(auVar87,auVar90);
  auVar101._0_4_ = auVar87._0_4_ * auVar94._0_4_;
  auVar101._4_4_ = auVar87._4_4_ * auVar94._4_4_;
  auVar101._8_4_ = auVar87._8_4_ * auVar94._8_4_;
  auVar101._12_4_ = auVar87._12_4_ * auVar94._12_4_;
  auVar101._16_4_ = auVar87._16_4_ * auVar94._16_4_;
  auVar101._20_4_ = auVar87._20_4_ * auVar94._20_4_;
  auVar101._24_4_ = auVar87._24_4_ * auVar94._24_4_;
  auVar101._28_4_ = 0;
  auVar94._4_4_ = auVar87._4_4_ * auVar97._4_4_;
  auVar94._0_4_ = auVar87._0_4_ * auVar97._0_4_;
  auVar94._8_4_ = auVar87._8_4_ * auVar97._8_4_;
  auVar94._12_4_ = auVar87._12_4_ * auVar97._12_4_;
  auVar94._16_4_ = auVar87._16_4_ * auVar97._16_4_;
  auVar94._20_4_ = auVar87._20_4_ * auVar97._20_4_;
  auVar94._24_4_ = auVar87._24_4_ * auVar97._24_4_;
  auVar94._28_4_ = auVar90._28_4_;
  auVar89 = vfmadd231ps_avx512vl(auVar88,auVar98,auVar89);
  auVar76 = vfmadd231ps_fma(auVar101,auVar98,auVar93);
  auVar2 = vfmadd231ps_fma(auVar94,auVar98,auVar96);
  auVar89 = vfmadd231ps_avx512vl(auVar89,auVar107,auVar91);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar107,auVar92);
  auVar2 = vfmadd231ps_fma(ZEXT1632(auVar2),auVar107,auVar95);
  auVar103._8_4_ = 0x7fffffff;
  auVar103._0_8_ = 0x7fffffff7fffffff;
  auVar103._12_4_ = 0x7fffffff;
  auVar103._16_4_ = 0x7fffffff;
  auVar103._20_4_ = 0x7fffffff;
  auVar103._24_4_ = 0x7fffffff;
  auVar103._28_4_ = 0x7fffffff;
  auVar91 = vandps_avx(ZEXT1632(auVar75),auVar103);
  auVar105._8_4_ = 0x219392ef;
  auVar105._0_8_ = 0x219392ef219392ef;
  auVar105._12_4_ = 0x219392ef;
  auVar105._16_4_ = 0x219392ef;
  auVar105._20_4_ = 0x219392ef;
  auVar105._24_4_ = 0x219392ef;
  auVar105._28_4_ = 0x219392ef;
  uVar67 = vcmpps_avx512vl(auVar91,auVar105,1);
  bVar68 = (bool)((byte)uVar67 & 1);
  auVar88._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar75._0_4_;
  bVar68 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar75._4_4_;
  bVar68 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar75._8_4_;
  bVar68 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar75._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(ZEXT1632(auVar15),auVar103);
  uVar67 = vcmpps_avx512vl(auVar91,auVar105,1);
  bVar68 = (bool)((byte)uVar67 & 1);
  auVar85._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar15._0_4_;
  bVar68 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar85._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar15._4_4_;
  bVar68 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar85._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar15._8_4_;
  bVar68 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar85._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar15._12_4_;
  auVar85._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar85._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar85._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar85._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  auVar91 = vandps_avx(ZEXT1632(auVar73),auVar103);
  uVar67 = vcmpps_avx512vl(auVar91,auVar105,1);
  bVar68 = (bool)((byte)uVar67 & 1);
  auVar91._0_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar73._0_4_;
  bVar68 = (bool)((byte)(uVar67 >> 1) & 1);
  auVar91._4_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar73._4_4_;
  bVar68 = (bool)((byte)(uVar67 >> 2) & 1);
  auVar91._8_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar73._8_4_;
  bVar68 = (bool)((byte)(uVar67 >> 3) & 1);
  auVar91._12_4_ = (uint)bVar68 * 0x219392ef | (uint)!bVar68 * auVar73._12_4_;
  auVar91._16_4_ = (uint)((byte)(uVar67 >> 4) & 1) * 0x219392ef;
  auVar91._20_4_ = (uint)((byte)(uVar67 >> 5) & 1) * 0x219392ef;
  auVar91._24_4_ = (uint)((byte)(uVar67 >> 6) & 1) * 0x219392ef;
  auVar91._28_4_ = (uint)(byte)(uVar67 >> 7) * 0x219392ef;
  auVar90 = vrcp14ps_avx512vl(auVar88);
  auVar104._8_4_ = 0x3f800000;
  auVar104._0_8_ = 0x3f8000003f800000;
  auVar104._12_4_ = 0x3f800000;
  auVar104._16_4_ = 0x3f800000;
  auVar104._20_4_ = 0x3f800000;
  auVar104._24_4_ = 0x3f800000;
  auVar104._28_4_ = 0x3f800000;
  auVar75 = vfnmadd213ps_fma(auVar88,auVar90,auVar104);
  auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar85);
  auVar15 = vfnmadd213ps_fma(auVar85,auVar90,auVar104);
  auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar90,auVar90);
  auVar90 = vrcp14ps_avx512vl(auVar91);
  auVar73 = vfnmadd213ps_fma(auVar91,auVar90,auVar104);
  auVar73 = vfmadd132ps_fma(ZEXT1632(auVar73),auVar90,auVar90);
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar62 * 7 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx512vl(auVar91,auVar89);
  auVar95._4_4_ = auVar75._4_4_ * auVar91._4_4_;
  auVar95._0_4_ = auVar75._0_4_ * auVar91._0_4_;
  auVar95._8_4_ = auVar75._8_4_ * auVar91._8_4_;
  auVar95._12_4_ = auVar75._12_4_ * auVar91._12_4_;
  auVar95._16_4_ = auVar91._16_4_ * 0.0;
  auVar95._20_4_ = auVar91._20_4_ * 0.0;
  auVar95._24_4_ = auVar91._24_4_ * 0.0;
  auVar95._28_4_ = auVar91._28_4_;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar62 * 9 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx512vl(auVar91,auVar89);
  auVar102._0_4_ = auVar75._0_4_ * auVar91._0_4_;
  auVar102._4_4_ = auVar75._4_4_ * auVar91._4_4_;
  auVar102._8_4_ = auVar75._8_4_ * auVar91._8_4_;
  auVar102._12_4_ = auVar75._12_4_ * auVar91._12_4_;
  auVar102._16_4_ = auVar91._16_4_ * 0.0;
  auVar102._20_4_ = auVar91._20_4_ * 0.0;
  auVar102._24_4_ = auVar91._24_4_ * 0.0;
  auVar102._28_4_ = 0;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar62 * 0xe + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar76));
  auVar96._4_4_ = auVar15._4_4_ * auVar91._4_4_;
  auVar96._0_4_ = auVar15._0_4_ * auVar91._0_4_;
  auVar96._8_4_ = auVar15._8_4_ * auVar91._8_4_;
  auVar96._12_4_ = auVar15._12_4_ * auVar91._12_4_;
  auVar96._16_4_ = auVar91._16_4_ * 0.0;
  auVar96._20_4_ = auVar91._20_4_ * 0.0;
  auVar96._24_4_ = auVar91._24_4_ * 0.0;
  auVar96._28_4_ = auVar91._28_4_;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)prim[1] * 0x10 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar76));
  auVar100._0_4_ = auVar15._0_4_ * auVar91._0_4_;
  auVar100._4_4_ = auVar15._4_4_ * auVar91._4_4_;
  auVar100._8_4_ = auVar15._8_4_ * auVar91._8_4_;
  auVar100._12_4_ = auVar15._12_4_ * auVar91._12_4_;
  auVar100._16_4_ = auVar91._16_4_ * 0.0;
  auVar100._20_4_ = auVar91._20_4_ * 0.0;
  auVar100._24_4_ = auVar91._24_4_ * 0.0;
  auVar100._28_4_ = 0;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar62 * 0x15 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar2));
  auVar97._4_4_ = auVar91._4_4_ * auVar73._4_4_;
  auVar97._0_4_ = auVar91._0_4_ * auVar73._0_4_;
  auVar97._8_4_ = auVar91._8_4_ * auVar73._8_4_;
  auVar97._12_4_ = auVar91._12_4_ * auVar73._12_4_;
  auVar97._16_4_ = auVar91._16_4_ * 0.0;
  auVar97._20_4_ = auVar91._20_4_ * 0.0;
  auVar97._24_4_ = auVar91._24_4_ * 0.0;
  auVar97._28_4_ = auVar91._28_4_;
  auVar91 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar62 * 0x17 + 6));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar91 = vsubps_avx(auVar91,ZEXT1632(auVar2));
  auVar86._0_4_ = auVar73._0_4_ * auVar91._0_4_;
  auVar86._4_4_ = auVar73._4_4_ * auVar91._4_4_;
  auVar86._8_4_ = auVar73._8_4_ * auVar91._8_4_;
  auVar86._12_4_ = auVar73._12_4_ * auVar91._12_4_;
  auVar86._16_4_ = auVar91._16_4_ * 0.0;
  auVar86._20_4_ = auVar91._20_4_ * 0.0;
  auVar86._24_4_ = auVar91._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar91 = vpminsd_avx2(auVar95,auVar102);
  auVar89 = vpminsd_avx2(auVar96,auVar100);
  auVar91 = vmaxps_avx(auVar91,auVar89);
  auVar89 = vpminsd_avx2(auVar97,auVar86);
  uVar156 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar90._4_4_ = uVar156;
  auVar90._0_4_ = uVar156;
  auVar90._8_4_ = uVar156;
  auVar90._12_4_ = uVar156;
  auVar90._16_4_ = uVar156;
  auVar90._20_4_ = uVar156;
  auVar90._24_4_ = uVar156;
  auVar90._28_4_ = uVar156;
  auVar89 = vmaxps_avx512vl(auVar89,auVar90);
  auVar91 = vmaxps_avx(auVar91,auVar89);
  auVar89._8_4_ = 0x3f7ffffa;
  auVar89._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar89._12_4_ = 0x3f7ffffa;
  auVar89._16_4_ = 0x3f7ffffa;
  auVar89._20_4_ = 0x3f7ffffa;
  auVar89._24_4_ = 0x3f7ffffa;
  auVar89._28_4_ = 0x3f7ffffa;
  local_280 = vmulps_avx512vl(auVar91,auVar89);
  auVar91 = vpmaxsd_avx2(auVar95,auVar102);
  auVar89 = vpmaxsd_avx2(auVar96,auVar100);
  auVar91 = vminps_avx(auVar91,auVar89);
  auVar89 = vpmaxsd_avx2(auVar97,auVar86);
  uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar92._4_4_ = uVar156;
  auVar92._0_4_ = uVar156;
  auVar92._8_4_ = uVar156;
  auVar92._12_4_ = uVar156;
  auVar92._16_4_ = uVar156;
  auVar92._20_4_ = uVar156;
  auVar92._24_4_ = uVar156;
  auVar92._28_4_ = uVar156;
  auVar89 = vminps_avx512vl(auVar89,auVar92);
  auVar91 = vminps_avx(auVar91,auVar89);
  auVar93._8_4_ = 0x3f800003;
  auVar93._0_8_ = 0x3f8000033f800003;
  auVar93._12_4_ = 0x3f800003;
  auVar93._16_4_ = 0x3f800003;
  auVar93._20_4_ = 0x3f800003;
  auVar93._24_4_ = 0x3f800003;
  auVar93._28_4_ = 0x3f800003;
  auVar91 = vmulps_avx512vl(auVar91,auVar93);
  auVar89 = vpbroadcastd_avx512vl();
  uVar17 = vcmpps_avx512vl(local_280,auVar91,2);
  uVar19 = vpcmpgtd_avx512vl(auVar89,_DAT_01fb4ba0);
  uVar67 = CONCAT44((int)((ulong)in_R11 >> 0x20),(uint)(byte)((byte)uVar17 & (byte)uVar19));
  local_480 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
LAB_01a10d85:
  if (uVar67 == 0) {
LAB_01a135e2:
    return uVar67 != 0;
  }
  lVar21 = 0;
  for (uVar62 = uVar67; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
    lVar21 = lVar21 + 1;
  }
  uVar3 = *(uint *)(prim + 2);
  pGVar4 = (context->scene->geometries).items[uVar3].ptr;
  lVar5 = *(long *)&pGVar4[1].time_range.upper;
  uVar62 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           (ulong)*(uint *)(prim + lVar21 * 4 + 6) *
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  auVar75 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * uVar62);
  auVar15 = *(undefined1 (*) [16])(lVar5 + (long)pGVar4[1].intersectionFilterN * (uVar62 + 1));
  auVar73 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar76 = vinsertps_avx(auVar73,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_540 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  local_560 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar73 = vunpcklps_avx512vl(local_540._0_16_,local_560._0_16_);
  _local_580 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar78 = local_580._0_16_;
  local_790 = vinsertps_avx512f(auVar73,auVar78,0x28);
  auVar80._8_4_ = 0xbeaaaaab;
  auVar80._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar80._12_4_ = 0xbeaaaaab;
  auVar77 = vfnmadd132ps_fma(*(undefined1 (*) [16])
                              (pGVar4[2].intersectionFilterN +
                              uVar62 * (long)pGVar4[2].pointQueryFunc),auVar75,auVar80);
  auVar2 = vfmadd132ps_fma(*(undefined1 (*) [16])
                            (pGVar4[2].intersectionFilterN +
                            (long)pGVar4[2].pointQueryFunc * (uVar62 + 1)),auVar15,auVar80);
  auVar224._0_4_ = auVar15._0_4_ + auVar75._0_4_ + auVar77._0_4_ + auVar2._0_4_;
  auVar224._4_4_ = auVar15._4_4_ + auVar75._4_4_ + auVar77._4_4_ + auVar2._4_4_;
  auVar224._8_4_ = auVar15._8_4_ + auVar75._8_4_ + auVar77._8_4_ + auVar2._8_4_;
  auVar224._12_4_ = auVar15._12_4_ + auVar75._12_4_ + auVar77._12_4_ + auVar2._12_4_;
  auVar79._8_4_ = 0x3e800000;
  auVar79._0_8_ = 0x3e8000003e800000;
  auVar79._12_4_ = 0x3e800000;
  auVar73 = vmulps_avx512vl(auVar224,auVar79);
  auVar73 = vsubps_avx(auVar73,auVar76);
  auVar73 = vdpps_avx(auVar73,local_790,0x7f);
  local_420 = vpbroadcastd_avx512vl();
  local_7a0 = vdpps_avx(local_790,local_790,0x7f);
  fVar1 = *(float *)(ray + k * 4 + 0x60);
  auVar84._4_12_ = ZEXT812(0) << 0x20;
  auVar84._0_4_ = local_7a0._0_4_;
  auVar74 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar84);
  auVar83 = vfnmadd213ss_fma(auVar74,local_7a0,ZEXT416(0x40000000));
  local_260 = auVar73._0_4_ * auVar74._0_4_ * auVar83._0_4_;
  auVar232 = ZEXT3264(_DAT_01f7b040);
  auVar81._4_4_ = local_260;
  auVar81._0_4_ = local_260;
  auVar81._8_4_ = local_260;
  auVar81._12_4_ = local_260;
  fStack_4f0 = local_260;
  _local_500 = auVar81;
  fStack_4ec = local_260;
  fStack_4e8 = local_260;
  fStack_4e4 = local_260;
  auVar73 = vfmadd231ps_fma(auVar76,local_790,auVar81);
  auVar73 = vblendps_avx(auVar73,ZEXT816(0) << 0x40,8);
  auVar75 = vsubps_avx(auVar75,auVar73);
  auVar76 = vsubps_avx(auVar2,auVar73);
  auVar2 = vsubps_avx(auVar77,auVar73);
  auVar15 = vsubps_avx(auVar15,auVar73);
  local_7c0 = vbroadcastss_avx512vl(auVar75);
  auVar256 = ZEXT3264(local_7c0);
  auVar110._8_4_ = 1;
  auVar110._0_8_ = 0x100000001;
  auVar110._12_4_ = 1;
  auVar110._16_4_ = 1;
  auVar110._20_4_ = 1;
  auVar110._24_4_ = 1;
  auVar110._28_4_ = 1;
  local_640 = ZEXT1632(auVar75);
  local_7e0 = vpermps_avx2(auVar110,local_640);
  auVar249 = ZEXT3264(local_7e0);
  auVar111._8_4_ = 2;
  auVar111._0_8_ = 0x200000002;
  auVar111._12_4_ = 2;
  auVar111._16_4_ = 2;
  auVar111._20_4_ = 2;
  auVar111._24_4_ = 2;
  auVar111._28_4_ = 2;
  local_800 = vpermps_avx2(auVar111,local_640);
  auVar252 = ZEXT3264(local_800);
  auVar112._8_4_ = 3;
  auVar112._0_8_ = 0x300000003;
  auVar112._12_4_ = 3;
  auVar112._16_4_ = 3;
  auVar112._20_4_ = 3;
  auVar112._24_4_ = 3;
  auVar112._28_4_ = 3;
  local_820 = vpermps_avx2(auVar112,local_640);
  auVar241 = ZEXT3264(local_820);
  fVar141 = auVar2._0_4_;
  auVar253._4_4_ = fVar141;
  auVar253._0_4_ = fVar141;
  auVar253._8_4_ = fVar141;
  auVar253._12_4_ = fVar141;
  auVar253._16_4_ = fVar141;
  auVar253._20_4_ = fVar141;
  auVar253._24_4_ = fVar141;
  auVar253._28_4_ = fVar141;
  local_680 = ZEXT1632(auVar2);
  local_840 = vpermps_avx2(auVar110,local_680);
  auVar255 = ZEXT3264(local_840);
  local_860 = vpermps_avx512vl(auVar111,local_680);
  local_880 = vpermps_avx2(auVar112,local_680);
  auVar91 = vbroadcastss_avx512vl(auVar76);
  local_660 = ZEXT1632(auVar76);
  auVar89 = vpermps_avx512vl(auVar110,local_660);
  auVar90 = vpermps_avx512vl(auVar111,local_660);
  auVar92 = vpermps_avx512vl(auVar112,local_660);
  auVar93 = vbroadcastss_avx512vl(auVar15);
  _local_6a0 = ZEXT1632(auVar15);
  auVar94 = vpermps_avx512vl(auVar110,_local_6a0);
  auVar95 = vpermps_avx512vl(auVar111,_local_6a0);
  auVar96 = vpermps_avx512vl(auVar112,_local_6a0);
  auVar243 = ZEXT3264(local_880);
  auVar75 = vmulss_avx512f(auVar78,auVar78);
  auVar97 = vfmadd231ps_avx512vl(ZEXT1632(auVar75),local_560,local_560);
  local_240 = vfmadd231ps_avx512vl(auVar97,local_540,local_540);
  local_220._0_4_ = local_240._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar109._8_4_ = 0x7fffffff;
  auVar109._0_8_ = 0x7fffffff7fffffff;
  auVar109._12_4_ = 0x7fffffff;
  auVar109._16_4_ = 0x7fffffff;
  auVar109._20_4_ = 0x7fffffff;
  auVar109._24_4_ = 0x7fffffff;
  auVar109._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar109);
  local_700 = ZEXT416((uint)local_260);
  local_260 = fVar1 - local_260;
  auVar237 = ZEXT3264(local_860);
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  uVar62 = 0;
  bVar61 = 0;
  local_ab4 = 1;
  local_440 = vpbroadcastd_avx512vl();
  auVar75 = vsqrtss_avx(local_7a0,local_7a0);
  auVar15 = vsqrtss_avx(local_7a0,local_7a0);
  auVar246 = ZEXT3264(local_840);
  local_490 = ZEXT816(0x3f80000000000000);
  auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar258 = ZEXT3264(auVar97);
  do {
    auVar73 = vmovshdup_avx(local_490);
    auVar73 = vsubps_avx(auVar73,local_490);
    fVar171 = auVar73._0_4_;
    fVar172 = fVar171 * 0.04761905;
    auVar195._0_4_ = local_490._0_4_;
    auVar195._4_4_ = auVar195._0_4_;
    auVar195._8_4_ = auVar195._0_4_;
    auVar195._12_4_ = auVar195._0_4_;
    auVar195._16_4_ = auVar195._0_4_;
    auVar195._20_4_ = auVar195._0_4_;
    auVar195._24_4_ = auVar195._0_4_;
    auVar195._28_4_ = auVar195._0_4_;
    auVar82._4_4_ = fVar171;
    auVar82._0_4_ = fVar171;
    auVar82._8_4_ = fVar171;
    auVar82._12_4_ = fVar171;
    auVar212._16_4_ = fVar171;
    auVar212._0_16_ = auVar82;
    auVar212._20_4_ = fVar171;
    auVar212._24_4_ = fVar171;
    auVar212._28_4_ = fVar171;
    auVar73 = vfmadd231ps_fma(auVar195,auVar212,auVar232._0_32_);
    auVar257 = auVar258._0_32_;
    auVar97 = vsubps_avx512vl(auVar257,ZEXT1632(auVar73));
    fVar155 = auVar73._0_4_;
    fVar168 = auVar73._4_4_;
    auVar220._4_4_ = fVar141 * fVar168;
    auVar220._0_4_ = fVar141 * fVar155;
    fVar169 = auVar73._8_4_;
    auVar220._8_4_ = fVar141 * fVar169;
    fVar170 = auVar73._12_4_;
    auVar220._12_4_ = fVar141 * fVar170;
    auVar220._16_4_ = fVar141 * 0.0;
    auVar220._20_4_ = fVar141 * 0.0;
    auVar220._24_4_ = fVar141 * 0.0;
    auVar220._28_4_ = auVar195._0_4_;
    auVar118._4_4_ = auVar246._4_4_ * fVar168;
    auVar118._0_4_ = auVar246._0_4_ * fVar155;
    auVar118._8_4_ = auVar246._8_4_ * fVar169;
    auVar118._12_4_ = auVar246._12_4_ * fVar170;
    auVar118._16_4_ = auVar246._16_4_ * 0.0;
    auVar118._20_4_ = auVar246._20_4_ * 0.0;
    auVar118._24_4_ = auVar246._24_4_ * 0.0;
    auVar118._28_4_ = fVar171;
    auVar57._4_4_ = auVar237._4_4_ * fVar168;
    auVar57._0_4_ = auVar237._0_4_ * fVar155;
    auVar57._8_4_ = auVar237._8_4_ * fVar169;
    auVar57._12_4_ = auVar237._12_4_ * fVar170;
    auVar57._16_4_ = auVar237._16_4_ * 0.0;
    auVar57._20_4_ = auVar237._20_4_ * 0.0;
    auVar57._24_4_ = auVar237._24_4_ * 0.0;
    auVar57._28_4_ = fVar141;
    auVar232._0_4_ = auVar243._0_4_ * fVar155;
    auVar232._4_4_ = auVar243._4_4_ * fVar168;
    auVar232._8_4_ = auVar243._8_4_ * fVar169;
    auVar232._12_4_ = auVar243._12_4_ * fVar170;
    auVar232._16_4_ = auVar243._16_4_ * 0.0;
    auVar232._20_4_ = auVar243._20_4_ * 0.0;
    auVar232._28_36_ = auVar237._28_36_;
    auVar232._24_4_ = auVar243._24_4_ * 0.0;
    auVar98 = vfmadd231ps_avx512vl(auVar220,auVar97,auVar256._0_32_);
    auVar76 = vfmadd231ps_fma(auVar118,auVar97,auVar249._0_32_);
    auVar2 = vfmadd231ps_fma(auVar57,auVar97,auVar252._0_32_);
    auVar77 = vfmadd231ps_fma(auVar232._0_32_,auVar97,auVar241._0_32_);
    auVar87 = vmulps_avx512vl(auVar91,ZEXT1632(auVar73));
    auVar86 = ZEXT1632(auVar73);
    auVar88 = vmulps_avx512vl(auVar89,auVar86);
    auVar99 = vmulps_avx512vl(auVar90,auVar86);
    auVar85 = vmulps_avx512vl(auVar92,auVar86);
    auVar83 = vfmadd231ps_fma(auVar87,auVar97,auVar253);
    auVar74 = vfmadd231ps_fma(auVar88,auVar97,auVar246._0_32_);
    auVar78 = vfmadd231ps_fma(auVar99,auVar97,auVar237._0_32_);
    auVar79 = vfmadd231ps_fma(auVar85,auVar97,auVar243._0_32_);
    auVar87 = vmulps_avx512vl(auVar93,auVar86);
    auVar88 = vmulps_avx512vl(auVar94,auVar86);
    auVar99 = vmulps_avx512vl(auVar95,auVar86);
    auVar85 = vmulps_avx512vl(auVar96,auVar86);
    auVar87 = vfmadd231ps_avx512vl(auVar87,auVar97,auVar91);
    auVar88 = vfmadd231ps_avx512vl(auVar88,auVar97,auVar89);
    auVar99 = vfmadd231ps_avx512vl(auVar99,auVar97,auVar90);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar97,auVar92);
    auVar237._28_36_ = auVar255._28_36_;
    auVar237._0_28_ =
         ZEXT1628(CONCAT412(fVar170 * auVar83._12_4_,
                            CONCAT48(fVar169 * auVar83._8_4_,
                                     CONCAT44(fVar168 * auVar83._4_4_,fVar155 * auVar83._0_4_))));
    auVar86 = vmulps_avx512vl(auVar86,ZEXT1632(auVar74));
    auVar100 = vmulps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar78));
    auVar101 = vmulps_avx512vl(ZEXT1632(auVar73),ZEXT1632(auVar79));
    auVar73 = vfmadd231ps_fma(auVar237._0_32_,auVar97,auVar98);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar97,ZEXT1632(auVar76));
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar97,ZEXT1632(auVar2));
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar97,ZEXT1632(auVar77));
    auVar235._0_4_ = auVar87._0_4_ * fVar155;
    auVar235._4_4_ = auVar87._4_4_ * fVar168;
    auVar235._8_4_ = auVar87._8_4_ * fVar169;
    auVar235._12_4_ = auVar87._12_4_ * fVar170;
    auVar235._16_4_ = auVar87._16_4_ * 0.0;
    auVar235._20_4_ = auVar87._20_4_ * 0.0;
    auVar235._24_4_ = auVar87._24_4_ * 0.0;
    auVar235._28_4_ = 0;
    auVar121._4_4_ = auVar88._4_4_ * fVar168;
    auVar121._0_4_ = auVar88._0_4_ * fVar155;
    auVar121._8_4_ = auVar88._8_4_ * fVar169;
    auVar121._12_4_ = auVar88._12_4_ * fVar170;
    auVar121._16_4_ = auVar88._16_4_ * 0.0;
    auVar121._20_4_ = auVar88._20_4_ * 0.0;
    auVar121._24_4_ = auVar88._24_4_ * 0.0;
    auVar121._28_4_ = auVar87._28_4_;
    auVar122._4_4_ = auVar99._4_4_ * fVar168;
    auVar122._0_4_ = auVar99._0_4_ * fVar155;
    auVar122._8_4_ = auVar99._8_4_ * fVar169;
    auVar122._12_4_ = auVar99._12_4_ * fVar170;
    auVar122._16_4_ = auVar99._16_4_ * 0.0;
    auVar122._20_4_ = auVar99._20_4_ * 0.0;
    auVar122._24_4_ = auVar99._24_4_ * 0.0;
    auVar122._28_4_ = auVar88._28_4_;
    auVar38._4_4_ = auVar85._4_4_ * fVar168;
    auVar38._0_4_ = auVar85._0_4_ * fVar155;
    auVar38._8_4_ = auVar85._8_4_ * fVar169;
    auVar38._12_4_ = auVar85._12_4_ * fVar170;
    auVar38._16_4_ = auVar85._16_4_ * 0.0;
    auVar38._20_4_ = auVar85._20_4_ * 0.0;
    auVar38._24_4_ = auVar85._24_4_ * 0.0;
    auVar38._28_4_ = auVar99._28_4_;
    auVar76 = vfmadd231ps_fma(auVar235,auVar97,ZEXT1632(auVar83));
    auVar2 = vfmadd231ps_fma(auVar121,auVar97,ZEXT1632(auVar74));
    auVar77 = vfmadd231ps_fma(auVar122,auVar97,ZEXT1632(auVar78));
    auVar83 = vfmadd231ps_fma(auVar38,auVar97,ZEXT1632(auVar79));
    auVar39._28_4_ = auVar98._28_4_;
    auVar39._0_28_ =
         ZEXT1628(CONCAT412(auVar77._12_4_ * fVar170,
                            CONCAT48(auVar77._8_4_ * fVar169,
                                     CONCAT44(auVar77._4_4_ * fVar168,auVar77._0_4_ * fVar155))));
    auVar74 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar170 * auVar76._12_4_,
                                                 CONCAT48(fVar169 * auVar76._8_4_,
                                                          CONCAT44(fVar168 * auVar76._4_4_,
                                                                   fVar155 * auVar76._0_4_)))),
                              auVar97,ZEXT1632(auVar73));
    auVar102 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar2._12_4_ * fVar170,
                                             CONCAT48(auVar2._8_4_ * fVar169,
                                                      CONCAT44(auVar2._4_4_ * fVar168,
                                                               auVar2._0_4_ * fVar155)))),auVar97,
                          auVar86);
    auVar103 = vfmadd231ps_avx512vl(auVar39,auVar97,auVar100);
    auVar98 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(auVar83._12_4_ * fVar170,
                                            CONCAT48(auVar83._8_4_ * fVar169,
                                                     CONCAT44(auVar83._4_4_ * fVar168,
                                                              auVar83._0_4_ * fVar155)))),auVar101,
                         auVar97);
    auVar97 = vsubps_avx(ZEXT1632(auVar76),ZEXT1632(auVar73));
    auVar87 = vsubps_avx512vl(ZEXT1632(auVar2),auVar86);
    auVar88 = vsubps_avx512vl(ZEXT1632(auVar77),auVar100);
    auVar99 = vsubps_avx512vl(ZEXT1632(auVar83),auVar101);
    auVar247._0_4_ = fVar172 * auVar97._0_4_ * 3.0;
    auVar247._4_4_ = fVar172 * auVar97._4_4_ * 3.0;
    auVar247._8_4_ = fVar172 * auVar97._8_4_ * 3.0;
    auVar247._12_4_ = fVar172 * auVar97._12_4_ * 3.0;
    auVar247._16_4_ = fVar172 * auVar97._16_4_ * 3.0;
    auVar247._20_4_ = fVar172 * auVar97._20_4_ * 3.0;
    auVar247._24_4_ = fVar172 * auVar97._24_4_ * 3.0;
    auVar247._28_4_ = 0;
    auVar251._0_4_ = fVar172 * auVar87._0_4_ * 3.0;
    auVar251._4_4_ = fVar172 * auVar87._4_4_ * 3.0;
    auVar251._8_4_ = fVar172 * auVar87._8_4_ * 3.0;
    auVar251._12_4_ = fVar172 * auVar87._12_4_ * 3.0;
    auVar251._16_4_ = fVar172 * auVar87._16_4_ * 3.0;
    auVar251._20_4_ = fVar172 * auVar87._20_4_ * 3.0;
    auVar251._24_4_ = fVar172 * auVar87._24_4_ * 3.0;
    auVar251._28_4_ = 0;
    auVar40._4_4_ = fVar172 * auVar88._4_4_ * 3.0;
    auVar40._0_4_ = fVar172 * auVar88._0_4_ * 3.0;
    auVar40._8_4_ = fVar172 * auVar88._8_4_ * 3.0;
    auVar40._12_4_ = fVar172 * auVar88._12_4_ * 3.0;
    auVar40._16_4_ = fVar172 * auVar88._16_4_ * 3.0;
    auVar40._20_4_ = fVar172 * auVar88._20_4_ * 3.0;
    auVar40._24_4_ = fVar172 * auVar88._24_4_ * 3.0;
    auVar40._28_4_ = auVar85._28_4_;
    fVar155 = auVar99._0_4_ * 3.0 * fVar172;
    fVar168 = auVar99._4_4_ * 3.0 * fVar172;
    auVar41._4_4_ = fVar168;
    auVar41._0_4_ = fVar155;
    fVar169 = auVar99._8_4_ * 3.0 * fVar172;
    auVar41._8_4_ = fVar169;
    fVar170 = auVar99._12_4_ * 3.0 * fVar172;
    auVar41._12_4_ = fVar170;
    fVar171 = auVar99._16_4_ * 3.0 * fVar172;
    auVar41._16_4_ = fVar171;
    fVar199 = auVar99._20_4_ * 3.0 * fVar172;
    auVar41._20_4_ = fVar199;
    fVar173 = auVar99._24_4_ * 3.0 * fVar172;
    auVar41._24_4_ = fVar173;
    auVar41._28_4_ = fVar172;
    auVar73 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    in_ZMM31 = ZEXT1664(auVar73);
    auVar85 = vpermt2ps_avx512vl(ZEXT1632(auVar74),_DAT_01fb9fc0,ZEXT1632(auVar73));
    auVar86 = vpermt2ps_avx512vl(auVar102,_DAT_01fb9fc0,ZEXT1632(auVar73));
    auVar87 = ZEXT1632(auVar73);
    auVar100 = vpermt2ps_avx512vl(auVar103,_DAT_01fb9fc0,auVar87);
    auVar229._0_4_ = auVar98._0_4_ + fVar155;
    auVar229._4_4_ = auVar98._4_4_ + fVar168;
    auVar229._8_4_ = auVar98._8_4_ + fVar169;
    auVar229._12_4_ = auVar98._12_4_ + fVar170;
    auVar229._16_4_ = auVar98._16_4_ + fVar171;
    auVar229._20_4_ = auVar98._20_4_ + fVar199;
    auVar229._24_4_ = auVar98._24_4_ + fVar173;
    auVar229._28_4_ = auVar98._28_4_ + fVar172;
    auVar97 = vmaxps_avx(auVar98,auVar229);
    auVar101 = vminps_avx512vl(auVar98,auVar229);
    auVar104 = vpermt2ps_avx512vl(auVar98,_DAT_01fb9fc0,auVar87);
    auVar105 = vpermt2ps_avx512vl(auVar247,_DAT_01fb9fc0,auVar87);
    auVar106 = vpermt2ps_avx512vl(auVar251,_DAT_01fb9fc0,auVar87);
    auVar118 = ZEXT1632(auVar73);
    auVar107 = vpermt2ps_avx512vl(auVar40,_DAT_01fb9fc0,auVar118);
    auVar98 = vpermt2ps_avx512vl(auVar41,_DAT_01fb9fc0,auVar118);
    auVar98 = vsubps_avx(auVar104,auVar98);
    auVar87 = vsubps_avx(auVar85,ZEXT1632(auVar74));
    auVar88 = vsubps_avx(auVar86,auVar102);
    auVar99 = vsubps_avx(auVar100,auVar103);
    auVar108 = vmulps_avx512vl(auVar88,auVar40);
    auVar108 = vfmsub231ps_avx512vl(auVar108,auVar251,auVar99);
    auVar109 = vmulps_avx512vl(auVar99,auVar247);
    auVar109 = vfmsub231ps_avx512vl(auVar109,auVar40,auVar87);
    auVar110 = vmulps_avx512vl(auVar87,auVar251);
    auVar110 = vfmsub231ps_avx512vl(auVar110,auVar247,auVar88);
    auVar110 = vmulps_avx512vl(auVar110,auVar110);
    auVar109 = vfmadd231ps_avx512vl(auVar110,auVar109,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar108,auVar108);
    auVar109 = vmulps_avx512vl(auVar99,auVar99);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar88,auVar88);
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar87,auVar87);
    auVar110 = vrcp14ps_avx512vl(auVar109);
    auVar111 = vfnmadd213ps_avx512vl(auVar110,auVar109,auVar257);
    auVar110 = vfmadd132ps_avx512vl(auVar111,auVar110,auVar110);
    auVar108 = vmulps_avx512vl(auVar108,auVar110);
    auVar111 = vmulps_avx512vl(auVar88,auVar107);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar106,auVar99);
    auVar112 = vmulps_avx512vl(auVar99,auVar105);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar107,auVar87);
    auVar113 = vmulps_avx512vl(auVar87,auVar106);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar105,auVar88);
    auVar113 = vmulps_avx512vl(auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar110 = vmulps_avx512vl(auVar111,auVar110);
    auVar108 = vmaxps_avx512vl(auVar108,auVar110);
    auVar108 = vsqrtps_avx512vl(auVar108);
    auVar110 = vmaxps_avx512vl(auVar98,auVar104);
    auVar97 = vmaxps_avx512vl(auVar97,auVar110);
    auVar110 = vaddps_avx512vl(auVar108,auVar97);
    auVar97 = vminps_avx(auVar98,auVar104);
    auVar97 = vminps_avx512vl(auVar101,auVar97);
    auVar97 = vsubps_avx512vl(auVar97,auVar108);
    auVar113._8_4_ = 0x3f800002;
    auVar113._0_8_ = 0x3f8000023f800002;
    auVar113._12_4_ = 0x3f800002;
    auVar113._16_4_ = 0x3f800002;
    auVar113._20_4_ = 0x3f800002;
    auVar113._24_4_ = 0x3f800002;
    auVar113._28_4_ = 0x3f800002;
    auVar98 = vmulps_avx512vl(auVar110,auVar113);
    auVar114._8_4_ = 0x3f7ffffc;
    auVar114._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar114._12_4_ = 0x3f7ffffc;
    auVar114._16_4_ = 0x3f7ffffc;
    auVar114._20_4_ = 0x3f7ffffc;
    auVar114._24_4_ = 0x3f7ffffc;
    auVar114._28_4_ = 0x3f7ffffc;
    auVar97 = vmulps_avx512vl(auVar97,auVar114);
    auVar98 = vmulps_avx512vl(auVar98,auVar98);
    auVar101 = vrsqrt14ps_avx512vl(auVar109);
    auVar115._8_4_ = 0xbf000000;
    auVar115._0_8_ = 0xbf000000bf000000;
    auVar115._12_4_ = 0xbf000000;
    auVar115._16_4_ = 0xbf000000;
    auVar115._20_4_ = 0xbf000000;
    auVar115._24_4_ = 0xbf000000;
    auVar115._28_4_ = 0xbf000000;
    auVar104 = vmulps_avx512vl(auVar109,auVar115);
    fVar155 = auVar101._0_4_;
    fVar168 = auVar101._4_4_;
    fVar169 = auVar101._8_4_;
    fVar170 = auVar101._12_4_;
    fVar172 = auVar101._16_4_;
    fVar171 = auVar101._20_4_;
    fVar199 = auVar101._24_4_;
    auVar42._4_4_ = fVar168 * fVar168 * fVar168 * auVar104._4_4_;
    auVar42._0_4_ = fVar155 * fVar155 * fVar155 * auVar104._0_4_;
    auVar42._8_4_ = fVar169 * fVar169 * fVar169 * auVar104._8_4_;
    auVar42._12_4_ = fVar170 * fVar170 * fVar170 * auVar104._12_4_;
    auVar42._16_4_ = fVar172 * fVar172 * fVar172 * auVar104._16_4_;
    auVar42._20_4_ = fVar171 * fVar171 * fVar171 * auVar104._20_4_;
    auVar42._24_4_ = fVar199 * fVar199 * fVar199 * auVar104._24_4_;
    auVar42._28_4_ = auVar110._28_4_;
    auVar116._8_4_ = 0x3fc00000;
    auVar116._0_8_ = 0x3fc000003fc00000;
    auVar116._12_4_ = 0x3fc00000;
    auVar116._16_4_ = 0x3fc00000;
    auVar116._20_4_ = 0x3fc00000;
    auVar116._24_4_ = 0x3fc00000;
    auVar116._28_4_ = 0x3fc00000;
    auVar101 = vfmadd231ps_avx512vl(auVar42,auVar101,auVar116);
    auVar255 = ZEXT3264(auVar101);
    auVar104 = vmulps_avx512vl(auVar87,auVar101);
    auVar108 = vmulps_avx512vl(auVar88,auVar101);
    auVar109 = vmulps_avx512vl(auVar99,auVar101);
    auVar220 = ZEXT1632(auVar74);
    auVar110 = vsubps_avx512vl(auVar118,auVar220);
    auVar111 = vsubps_avx512vl(auVar118,auVar102);
    auVar112 = vsubps_avx512vl(auVar118,auVar103);
    auVar113 = vmulps_avx512vl(_local_580,auVar112);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_560,auVar111);
    auVar113 = vfmadd231ps_avx512vl(auVar113,local_540,auVar110);
    auVar114 = vmulps_avx512vl(auVar112,auVar112);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar111,auVar111);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar110,auVar110);
    auVar115 = vmulps_avx512vl(_local_580,auVar109);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar108,local_560);
    auVar115 = vfmadd231ps_avx512vl(auVar115,auVar104,local_540);
    auVar109 = vmulps_avx512vl(auVar112,auVar109);
    auVar108 = vfmadd231ps_avx512vl(auVar109,auVar111,auVar108);
    auVar104 = vfmadd231ps_avx512vl(auVar108,auVar110,auVar104);
    auVar108 = vmulps_avx512vl(auVar115,auVar115);
    auVar109 = vsubps_avx512vl(local_220,auVar108);
    auVar116 = vmulps_avx512vl(auVar115,auVar104);
    auVar113 = vsubps_avx512vl(auVar113,auVar116);
    auVar113 = vaddps_avx512vl(auVar113,auVar113);
    auVar116 = vmulps_avx512vl(auVar104,auVar104);
    local_740 = vsubps_avx512vl(auVar114,auVar116);
    auVar98 = vsubps_avx512vl(local_740,auVar98);
    local_5a0 = vmulps_avx512vl(auVar113,auVar113);
    auVar117._8_4_ = 0x40800000;
    auVar117._0_8_ = 0x4080000040800000;
    auVar117._12_4_ = 0x40800000;
    auVar117._16_4_ = 0x40800000;
    auVar117._20_4_ = 0x40800000;
    auVar117._24_4_ = 0x40800000;
    auVar117._28_4_ = 0x40800000;
    _local_5c0 = vmulps_avx512vl(auVar109,auVar117);
    auVar114 = vmulps_avx512vl(_local_5c0,auVar98);
    auVar114 = vsubps_avx512vl(local_5a0,auVar114);
    uVar71 = vcmpps_avx512vl(auVar114,auVar118,5);
    bVar58 = (byte)uVar71;
    if (bVar58 == 0) {
LAB_01a11a17:
      auVar232 = ZEXT3264(_DAT_01f7b040);
      auVar256 = ZEXT3264(local_7c0);
      auVar249 = ZEXT3264(local_7e0);
      auVar252 = ZEXT3264(local_800);
      auVar241 = ZEXT3264(local_820);
      auVar246 = ZEXT3264(local_840);
      auVar237 = ZEXT3264(local_860);
      auVar243 = ZEXT3264(local_880);
    }
    else {
      auVar114 = vsqrtps_avx512vl(auVar114);
      auVar116 = vaddps_avx512vl(auVar109,auVar109);
      local_760 = vrcp14ps_avx512vl(auVar116);
      in_ZMM31 = ZEXT3264(local_760);
      auVar117 = vfnmadd213ps_avx512vl(local_760,auVar116,auVar257);
      auVar117 = vfmadd132ps_avx512vl(auVar117,local_760,local_760);
      auVar257._8_4_ = 0x80000000;
      auVar257._0_8_ = 0x8000000080000000;
      auVar257._12_4_ = 0x80000000;
      auVar257._16_4_ = 0x80000000;
      auVar257._20_4_ = 0x80000000;
      auVar257._24_4_ = 0x80000000;
      auVar257._28_4_ = 0x80000000;
      local_5e0 = vxorps_avx512vl(auVar113,auVar257);
      auVar118 = vsubps_avx512vl(local_5e0,auVar114);
      local_6c0 = vmulps_avx512vl(auVar118,auVar117);
      auVar114 = vsubps_avx512vl(auVar114,auVar113);
      local_780 = vmulps_avx512vl(auVar114,auVar117);
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar117 = vblendmps_avx512vl(auVar114,local_6c0);
      auVar119._0_4_ =
           (uint)(bVar58 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar114._0_4_;
      bVar68 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar119._4_4_ = (uint)bVar68 * auVar117._4_4_ | (uint)!bVar68 * auVar114._4_4_;
      bVar68 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar119._8_4_ = (uint)bVar68 * auVar117._8_4_ | (uint)!bVar68 * auVar114._8_4_;
      bVar68 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar119._12_4_ = (uint)bVar68 * auVar117._12_4_ | (uint)!bVar68 * auVar114._12_4_;
      bVar68 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar119._16_4_ = (uint)bVar68 * auVar117._16_4_ | (uint)!bVar68 * auVar114._16_4_;
      bVar68 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar119._20_4_ = (uint)bVar68 * auVar117._20_4_ | (uint)!bVar68 * auVar114._20_4_;
      bVar68 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar119._24_4_ = (uint)bVar68 * auVar117._24_4_ | (uint)!bVar68 * auVar114._24_4_;
      bVar68 = SUB81(uVar71 >> 7,0);
      auVar119._28_4_ = (uint)bVar68 * auVar117._28_4_ | (uint)!bVar68 * auVar114._28_4_;
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar117 = vblendmps_avx512vl(auVar114,local_780);
      auVar120._0_4_ =
           (uint)(bVar58 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar58 & 1) * auVar114._0_4_;
      bVar68 = (bool)((byte)(uVar71 >> 1) & 1);
      auVar120._4_4_ = (uint)bVar68 * auVar117._4_4_ | (uint)!bVar68 * auVar114._4_4_;
      bVar68 = (bool)((byte)(uVar71 >> 2) & 1);
      auVar120._8_4_ = (uint)bVar68 * auVar117._8_4_ | (uint)!bVar68 * auVar114._8_4_;
      bVar68 = (bool)((byte)(uVar71 >> 3) & 1);
      auVar120._12_4_ = (uint)bVar68 * auVar117._12_4_ | (uint)!bVar68 * auVar114._12_4_;
      bVar68 = (bool)((byte)(uVar71 >> 4) & 1);
      auVar120._16_4_ = (uint)bVar68 * auVar117._16_4_ | (uint)!bVar68 * auVar114._16_4_;
      bVar68 = (bool)((byte)(uVar71 >> 5) & 1);
      auVar120._20_4_ = (uint)bVar68 * auVar117._20_4_ | (uint)!bVar68 * auVar114._20_4_;
      bVar68 = (bool)((byte)(uVar71 >> 6) & 1);
      auVar120._24_4_ = (uint)bVar68 * auVar117._24_4_ | (uint)!bVar68 * auVar114._24_4_;
      bVar68 = SUB81(uVar71 >> 7,0);
      auVar120._28_4_ = (uint)bVar68 * auVar117._28_4_ | (uint)!bVar68 * auVar114._28_4_;
      auVar114 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar108,auVar114);
      local_600 = vmaxps_avx512vl(local_240,auVar114);
      auVar32._8_4_ = 0x36000000;
      auVar32._0_8_ = 0x3600000036000000;
      auVar32._12_4_ = 0x36000000;
      auVar32._16_4_ = 0x36000000;
      auVar32._20_4_ = 0x36000000;
      auVar32._24_4_ = 0x36000000;
      auVar32._28_4_ = 0x36000000;
      local_620 = vmulps_avx512vl(local_600,auVar32);
      vandps_avx512vl(auVar109,auVar114);
      uVar65 = vcmpps_avx512vl(local_620,local_620,1);
      uVar71 = uVar71 & uVar65;
      bVar66 = (byte)uVar71;
      if (bVar66 != 0) {
        uVar65 = vcmpps_avx512vl(auVar98,_DAT_01f7b000,2);
        auVar98 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar108 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar109 = vblendmps_avx512vl(auVar98,auVar108);
        bVar63 = (byte)uVar65;
        uVar72 = (uint)(bVar63 & 1) * auVar109._0_4_ | (uint)!(bool)(bVar63 & 1) * local_620._0_4_;
        bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
        uVar134 = (uint)bVar68 * auVar109._4_4_ | (uint)!bVar68 * local_620._4_4_;
        bVar68 = (bool)((byte)(uVar65 >> 2) & 1);
        uVar135 = (uint)bVar68 * auVar109._8_4_ | (uint)!bVar68 * local_620._8_4_;
        bVar68 = (bool)((byte)(uVar65 >> 3) & 1);
        uVar136 = (uint)bVar68 * auVar109._12_4_ | (uint)!bVar68 * local_620._12_4_;
        bVar68 = (bool)((byte)(uVar65 >> 4) & 1);
        uVar137 = (uint)bVar68 * auVar109._16_4_ | (uint)!bVar68 * local_620._16_4_;
        bVar68 = (bool)((byte)(uVar65 >> 5) & 1);
        uVar138 = (uint)bVar68 * auVar109._20_4_ | (uint)!bVar68 * local_620._20_4_;
        bVar68 = (bool)((byte)(uVar65 >> 6) & 1);
        uVar139 = (uint)bVar68 * auVar109._24_4_ | (uint)!bVar68 * local_620._24_4_;
        bVar68 = SUB81(uVar65 >> 7,0);
        uVar140 = (uint)bVar68 * auVar109._28_4_ | (uint)!bVar68 * local_620._28_4_;
        auVar119._0_4_ = (bVar66 & 1) * uVar72 | !(bool)(bVar66 & 1) * auVar119._0_4_;
        bVar68 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar119._4_4_ = bVar68 * uVar134 | !bVar68 * auVar119._4_4_;
        bVar68 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar119._8_4_ = bVar68 * uVar135 | !bVar68 * auVar119._8_4_;
        bVar68 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar119._12_4_ = bVar68 * uVar136 | !bVar68 * auVar119._12_4_;
        bVar68 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar119._16_4_ = bVar68 * uVar137 | !bVar68 * auVar119._16_4_;
        bVar68 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar119._20_4_ = bVar68 * uVar138 | !bVar68 * auVar119._20_4_;
        bVar68 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar119._24_4_ = bVar68 * uVar139 | !bVar68 * auVar119._24_4_;
        bVar68 = SUB81(uVar71 >> 7,0);
        auVar119._28_4_ = bVar68 * uVar140 | !bVar68 * auVar119._28_4_;
        auVar98 = vblendmps_avx512vl(auVar108,auVar98);
        bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
        bVar8 = (bool)((byte)(uVar65 >> 2) & 1);
        bVar9 = (bool)((byte)(uVar65 >> 3) & 1);
        bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar65 >> 5) & 1);
        bVar12 = (bool)((byte)(uVar65 >> 6) & 1);
        bVar13 = SUB81(uVar65 >> 7,0);
        auVar120._0_4_ =
             (uint)(bVar66 & 1) *
             ((uint)(bVar63 & 1) * auVar98._0_4_ | !(bool)(bVar63 & 1) * uVar72) |
             !(bool)(bVar66 & 1) * auVar120._0_4_;
        bVar7 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar120._4_4_ =
             (uint)bVar7 * ((uint)bVar68 * auVar98._4_4_ | !bVar68 * uVar134) |
             !bVar7 * auVar120._4_4_;
        bVar68 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar120._8_4_ =
             (uint)bVar68 * ((uint)bVar8 * auVar98._8_4_ | !bVar8 * uVar135) |
             !bVar68 * auVar120._8_4_;
        bVar68 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar120._12_4_ =
             (uint)bVar68 * ((uint)bVar9 * auVar98._12_4_ | !bVar9 * uVar136) |
             !bVar68 * auVar120._12_4_;
        bVar68 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar120._16_4_ =
             (uint)bVar68 * ((uint)bVar10 * auVar98._16_4_ | !bVar10 * uVar137) |
             !bVar68 * auVar120._16_4_;
        bVar68 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar120._20_4_ =
             (uint)bVar68 * ((uint)bVar11 * auVar98._20_4_ | !bVar11 * uVar138) |
             !bVar68 * auVar120._20_4_;
        bVar68 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar120._24_4_ =
             (uint)bVar68 * ((uint)bVar12 * auVar98._24_4_ | !bVar12 * uVar139) |
             !bVar68 * auVar120._24_4_;
        bVar68 = SUB81(uVar71 >> 7,0);
        auVar120._28_4_ =
             (uint)bVar68 * ((uint)bVar13 * auVar98._28_4_ | !bVar13 * uVar140) |
             !bVar68 * auVar120._28_4_;
        bVar58 = (~bVar66 | bVar63) & bVar58;
      }
      if ((bVar58 & 0x7f) == 0) {
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar258 = ZEXT3264(auVar97);
        goto LAB_01a11a17;
      }
      auVar98 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar107 = vxorps_avx512vl(auVar107,auVar98);
      auVar105 = vxorps_avx512vl(auVar105,auVar98);
      auVar232 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
      auVar106 = vxorps_avx512vl(auVar106,auVar98);
      auVar73 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x100)),
                               ZEXT416((uint)local_700._0_4_));
      auVar108 = vbroadcastss_avx512vl(auVar73);
      auVar108 = vminps_avx512vl(auVar108,auVar120);
      auVar56._4_4_ = fStack_25c;
      auVar56._0_4_ = local_260;
      auVar56._8_4_ = fStack_258;
      auVar56._12_4_ = fStack_254;
      auVar56._16_4_ = fStack_250;
      auVar56._20_4_ = fStack_24c;
      auVar56._24_4_ = fStack_248;
      auVar56._28_4_ = fStack_244;
      auVar109 = vmaxps_avx512vl(auVar56,auVar119);
      auVar112 = vmulps_avx512vl(auVar112,auVar40);
      auVar111 = vfmadd213ps_avx512vl(auVar111,auVar251,auVar112);
      auVar73 = vfmadd213ps_fma(auVar110,auVar247,auVar111);
      in_ZMM31 = ZEXT3264(_local_580);
      auVar110 = vmulps_avx512vl(_local_580,auVar40);
      auVar110 = vfmadd231ps_avx512vl(auVar110,local_560,auVar251);
      auVar110 = vfmadd231ps_avx512vl(auVar110,local_540,auVar247);
      auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar110,auVar111);
      auVar112 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar17 = vcmpps_avx512vl(auVar111,auVar112,1);
      auVar114 = vxorps_avx512vl(ZEXT1632(auVar73),auVar98);
      auVar117 = vrcp14ps_avx512vl(auVar110);
      auVar118 = vxorps_avx512vl(auVar110,auVar98);
      auVar121 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
      auVar122 = vfnmadd213ps_avx512vl(auVar117,auVar110,auVar121);
      auVar73 = vfmadd132ps_fma(auVar122,auVar117,auVar117);
      fVar155 = auVar73._0_4_ * auVar114._0_4_;
      fVar168 = auVar73._4_4_ * auVar114._4_4_;
      auVar43._4_4_ = fVar168;
      auVar43._0_4_ = fVar155;
      fVar169 = auVar73._8_4_ * auVar114._8_4_;
      auVar43._8_4_ = fVar169;
      fVar170 = auVar73._12_4_ * auVar114._12_4_;
      auVar43._12_4_ = fVar170;
      fVar172 = auVar114._16_4_ * 0.0;
      auVar43._16_4_ = fVar172;
      fVar171 = auVar114._20_4_ * 0.0;
      auVar43._20_4_ = fVar171;
      fVar199 = auVar114._24_4_ * 0.0;
      auVar43._24_4_ = fVar199;
      auVar43._28_4_ = auVar114._28_4_;
      uVar19 = vcmpps_avx512vl(auVar110,auVar118,1);
      bVar66 = (byte)uVar17 | (byte)uVar19;
      auVar254._8_4_ = 0xff800000;
      auVar254._0_8_ = 0xff800000ff800000;
      auVar254._12_4_ = 0xff800000;
      auVar254._16_4_ = 0xff800000;
      auVar254._20_4_ = 0xff800000;
      auVar254._24_4_ = 0xff800000;
      auVar254._28_4_ = 0xff800000;
      auVar122 = vblendmps_avx512vl(auVar43,auVar254);
      auVar123._0_4_ =
           (uint)(bVar66 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar117._0_4_;
      bVar68 = (bool)(bVar66 >> 1 & 1);
      auVar123._4_4_ = (uint)bVar68 * auVar122._4_4_ | (uint)!bVar68 * auVar117._4_4_;
      bVar68 = (bool)(bVar66 >> 2 & 1);
      auVar123._8_4_ = (uint)bVar68 * auVar122._8_4_ | (uint)!bVar68 * auVar117._8_4_;
      bVar68 = (bool)(bVar66 >> 3 & 1);
      auVar123._12_4_ = (uint)bVar68 * auVar122._12_4_ | (uint)!bVar68 * auVar117._12_4_;
      bVar68 = (bool)(bVar66 >> 4 & 1);
      auVar123._16_4_ = (uint)bVar68 * auVar122._16_4_ | (uint)!bVar68 * auVar117._16_4_;
      bVar68 = (bool)(bVar66 >> 5 & 1);
      auVar123._20_4_ = (uint)bVar68 * auVar122._20_4_ | (uint)!bVar68 * auVar117._20_4_;
      bVar68 = (bool)(bVar66 >> 6 & 1);
      auVar123._24_4_ = (uint)bVar68 * auVar122._24_4_ | (uint)!bVar68 * auVar117._24_4_;
      auVar123._28_4_ =
           (uint)(bVar66 >> 7) * auVar122._28_4_ | (uint)!(bool)(bVar66 >> 7) * auVar117._28_4_;
      auVar109 = vmaxps_avx512vl(auVar109,auVar123);
      uVar19 = vcmpps_avx512vl(auVar110,auVar118,6);
      bVar66 = (byte)uVar17 | (byte)uVar19;
      auVar110 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar124._0_4_ =
           (uint)(bVar66 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar66 & 1) * (int)fVar155;
      bVar68 = (bool)(bVar66 >> 1 & 1);
      auVar124._4_4_ = (uint)bVar68 * auVar110._4_4_ | (uint)!bVar68 * (int)fVar168;
      bVar68 = (bool)(bVar66 >> 2 & 1);
      auVar124._8_4_ = (uint)bVar68 * auVar110._8_4_ | (uint)!bVar68 * (int)fVar169;
      bVar68 = (bool)(bVar66 >> 3 & 1);
      auVar124._12_4_ = (uint)bVar68 * auVar110._12_4_ | (uint)!bVar68 * (int)fVar170;
      bVar68 = (bool)(bVar66 >> 4 & 1);
      auVar124._16_4_ = (uint)bVar68 * auVar110._16_4_ | (uint)!bVar68 * (int)fVar172;
      bVar68 = (bool)(bVar66 >> 5 & 1);
      auVar124._20_4_ = (uint)bVar68 * auVar110._20_4_ | (uint)!bVar68 * (int)fVar171;
      bVar68 = (bool)(bVar66 >> 6 & 1);
      auVar124._24_4_ = (uint)bVar68 * auVar110._24_4_ | (uint)!bVar68 * (int)fVar199;
      auVar124._28_4_ =
           (uint)(bVar66 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar66 >> 7) * auVar114._28_4_;
      auVar114 = vminps_avx512vl(auVar108,auVar124);
      auVar76 = vxorps_avx512vl(auVar108._0_16_,auVar108._0_16_);
      auVar85 = vsubps_avx512vl(ZEXT1632(auVar76),auVar85);
      auVar86 = vsubps_avx512vl(ZEXT1632(auVar76),auVar86);
      auVar100 = vsubps_avx512vl(ZEXT1632(auVar76),auVar100);
      auVar100 = vmulps_avx512vl(auVar100,auVar107);
      auVar86 = vfmadd231ps_avx512vl(auVar100,auVar106,auVar86);
      auVar85 = vfmadd231ps_avx512vl(auVar86,auVar105,auVar85);
      auVar86 = vmulps_avx512vl(_local_580,auVar107);
      auVar86 = vfmadd231ps_avx512vl(auVar86,local_560,auVar106);
      auVar86 = vfmadd231ps_avx512vl(auVar86,local_540,auVar105);
      vandps_avx512vl(auVar86,auVar111);
      uVar17 = vcmpps_avx512vl(auVar86,auVar112,1);
      auVar85 = vxorps_avx512vl(auVar85,auVar98);
      auVar100 = vrcp14ps_avx512vl(auVar86);
      auVar98 = vxorps_avx512vl(auVar86,auVar98);
      auVar105 = vfnmadd213ps_avx512vl(auVar100,auVar86,auVar121);
      auVar73 = vfmadd132ps_fma(auVar105,auVar100,auVar100);
      fVar155 = auVar73._0_4_ * auVar85._0_4_;
      fVar168 = auVar73._4_4_ * auVar85._4_4_;
      auVar44._4_4_ = fVar168;
      auVar44._0_4_ = fVar155;
      fVar169 = auVar73._8_4_ * auVar85._8_4_;
      auVar44._8_4_ = fVar169;
      fVar170 = auVar73._12_4_ * auVar85._12_4_;
      auVar44._12_4_ = fVar170;
      fVar172 = auVar85._16_4_ * 0.0;
      auVar44._16_4_ = fVar172;
      fVar171 = auVar85._20_4_ * 0.0;
      auVar44._20_4_ = fVar171;
      fVar199 = auVar85._24_4_ * 0.0;
      auVar44._24_4_ = fVar199;
      auVar44._28_4_ = auVar85._28_4_;
      uVar19 = vcmpps_avx512vl(auVar86,auVar98,1);
      bVar66 = (byte)uVar17 | (byte)uVar19;
      auVar105 = vblendmps_avx512vl(auVar44,auVar254);
      auVar125._0_4_ =
           (uint)(bVar66 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar100._0_4_;
      bVar68 = (bool)(bVar66 >> 1 & 1);
      auVar125._4_4_ = (uint)bVar68 * auVar105._4_4_ | (uint)!bVar68 * auVar100._4_4_;
      bVar68 = (bool)(bVar66 >> 2 & 1);
      auVar125._8_4_ = (uint)bVar68 * auVar105._8_4_ | (uint)!bVar68 * auVar100._8_4_;
      bVar68 = (bool)(bVar66 >> 3 & 1);
      auVar125._12_4_ = (uint)bVar68 * auVar105._12_4_ | (uint)!bVar68 * auVar100._12_4_;
      bVar68 = (bool)(bVar66 >> 4 & 1);
      auVar125._16_4_ = (uint)bVar68 * auVar105._16_4_ | (uint)!bVar68 * auVar100._16_4_;
      bVar68 = (bool)(bVar66 >> 5 & 1);
      auVar125._20_4_ = (uint)bVar68 * auVar105._20_4_ | (uint)!bVar68 * auVar100._20_4_;
      bVar68 = (bool)(bVar66 >> 6 & 1);
      auVar125._24_4_ = (uint)bVar68 * auVar105._24_4_ | (uint)!bVar68 * auVar100._24_4_;
      auVar125._28_4_ =
           (uint)(bVar66 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar66 >> 7) * auVar100._28_4_;
      local_520 = vmaxps_avx(auVar109,auVar125);
      uVar19 = vcmpps_avx512vl(auVar86,auVar98,6);
      bVar66 = (byte)uVar17 | (byte)uVar19;
      auVar126._0_4_ =
           (uint)(bVar66 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar66 & 1) * (int)fVar155;
      bVar68 = (bool)(bVar66 >> 1 & 1);
      auVar126._4_4_ = (uint)bVar68 * auVar110._4_4_ | (uint)!bVar68 * (int)fVar168;
      bVar68 = (bool)(bVar66 >> 2 & 1);
      auVar126._8_4_ = (uint)bVar68 * auVar110._8_4_ | (uint)!bVar68 * (int)fVar169;
      bVar68 = (bool)(bVar66 >> 3 & 1);
      auVar126._12_4_ = (uint)bVar68 * auVar110._12_4_ | (uint)!bVar68 * (int)fVar170;
      bVar68 = (bool)(bVar66 >> 4 & 1);
      auVar126._16_4_ = (uint)bVar68 * auVar110._16_4_ | (uint)!bVar68 * (int)fVar172;
      bVar68 = (bool)(bVar66 >> 5 & 1);
      auVar126._20_4_ = (uint)bVar68 * auVar110._20_4_ | (uint)!bVar68 * (int)fVar171;
      bVar68 = (bool)(bVar66 >> 6 & 1);
      auVar126._24_4_ = (uint)bVar68 * auVar110._24_4_ | (uint)!bVar68 * (int)fVar199;
      auVar126._28_4_ =
           (uint)(bVar66 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar66 >> 7) * auVar85._28_4_;
      local_2c0 = vminps_avx(auVar114,auVar126);
      uVar17 = vcmpps_avx512vl(local_520,local_2c0,2);
      bVar58 = bVar58 & 0x7f & (byte)uVar17;
      if (bVar58 == 0) {
        auVar258 = ZEXT3264(auVar121);
        goto LAB_01a11a17;
      }
      auVar98 = vmaxps_avx512vl(ZEXT1632(auVar76),auVar97);
      auVar97 = vfmadd213ps_avx512vl(local_6c0,auVar115,auVar104);
      fVar155 = auVar101._0_4_;
      fVar168 = auVar101._4_4_;
      auVar45._4_4_ = fVar168 * auVar97._4_4_;
      auVar45._0_4_ = fVar155 * auVar97._0_4_;
      fVar169 = auVar101._8_4_;
      auVar45._8_4_ = fVar169 * auVar97._8_4_;
      fVar170 = auVar101._12_4_;
      auVar45._12_4_ = fVar170 * auVar97._12_4_;
      fVar172 = auVar101._16_4_;
      auVar45._16_4_ = fVar172 * auVar97._16_4_;
      fVar171 = auVar101._20_4_;
      auVar45._20_4_ = fVar171 * auVar97._20_4_;
      fVar199 = auVar101._24_4_;
      auVar45._24_4_ = fVar199 * auVar97._24_4_;
      auVar45._28_4_ = auVar97._28_4_;
      auVar97 = vfmadd213ps_avx512vl(local_780,auVar115,auVar104);
      auVar46._4_4_ = fVar168 * auVar97._4_4_;
      auVar46._0_4_ = fVar155 * auVar97._0_4_;
      auVar46._8_4_ = fVar169 * auVar97._8_4_;
      auVar46._12_4_ = fVar170 * auVar97._12_4_;
      auVar46._16_4_ = fVar172 * auVar97._16_4_;
      auVar46._20_4_ = fVar171 * auVar97._20_4_;
      auVar46._24_4_ = fVar199 * auVar97._24_4_;
      auVar46._28_4_ = auVar97._28_4_;
      auVar97 = vminps_avx512vl(auVar45,auVar121);
      auVar53 = ZEXT812(0);
      auVar85 = ZEXT1232(auVar53) << 0x20;
      auVar97 = vmaxps_avx(auVar97,ZEXT1232(auVar53) << 0x20);
      auVar86 = vminps_avx512vl(auVar46,auVar121);
      auVar47._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
      auVar47._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
      auVar47._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
      auVar47._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
      auVar47._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
      auVar47._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
      auVar47._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
      auVar47._28_4_ = auVar97._28_4_ + 7.0;
      local_1e0 = vfmadd213ps_avx512vl(auVar47,auVar212,auVar195);
      auVar97 = vmaxps_avx(auVar86,ZEXT1232(auVar53) << 0x20);
      auVar48._4_4_ = (auVar97._4_4_ + 1.0) * 0.125;
      auVar48._0_4_ = (auVar97._0_4_ + 0.0) * 0.125;
      auVar48._8_4_ = (auVar97._8_4_ + 2.0) * 0.125;
      auVar48._12_4_ = (auVar97._12_4_ + 3.0) * 0.125;
      auVar48._16_4_ = (auVar97._16_4_ + 4.0) * 0.125;
      auVar48._20_4_ = (auVar97._20_4_ + 5.0) * 0.125;
      auVar48._24_4_ = (auVar97._24_4_ + 6.0) * 0.125;
      auVar48._28_4_ = auVar97._28_4_ + 7.0;
      local_200 = vfmadd213ps_avx512vl(auVar48,auVar212,auVar195);
      auVar49._4_4_ = auVar98._4_4_ * auVar98._4_4_;
      auVar49._0_4_ = auVar98._0_4_ * auVar98._0_4_;
      auVar49._8_4_ = auVar98._8_4_ * auVar98._8_4_;
      auVar49._12_4_ = auVar98._12_4_ * auVar98._12_4_;
      auVar49._16_4_ = auVar98._16_4_ * auVar98._16_4_;
      auVar49._20_4_ = auVar98._20_4_ * auVar98._20_4_;
      auVar49._24_4_ = auVar98._24_4_ * auVar98._24_4_;
      auVar49._28_4_ = auVar98._28_4_;
      auVar97 = vsubps_avx(local_740,auVar49);
      auVar50._4_4_ = auVar97._4_4_ * (float)local_5c0._4_4_;
      auVar50._0_4_ = auVar97._0_4_ * (float)local_5c0._0_4_;
      auVar50._8_4_ = auVar97._8_4_ * fStack_5b8;
      auVar50._12_4_ = auVar97._12_4_ * fStack_5b4;
      auVar50._16_4_ = auVar97._16_4_ * fStack_5b0;
      auVar50._20_4_ = auVar97._20_4_ * fStack_5ac;
      auVar50._24_4_ = auVar97._24_4_ * fStack_5a8;
      auVar50._28_4_ = auVar98._28_4_;
      auVar98 = vsubps_avx(local_5a0,auVar50);
      uVar17 = vcmpps_avx512vl(auVar98,ZEXT1232(auVar53) << 0x20,5);
      bVar66 = (byte)uVar17;
      if (bVar66 == 0) {
        bVar66 = 0;
        auVar87 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar237 = ZEXT864(0) << 0x20;
        auVar98 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar86 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar245 = SUB6428(ZEXT864(0),0) << 0x20;
        auVar127._8_4_ = 0x7f800000;
        auVar127._0_8_ = 0x7f8000007f800000;
        auVar127._12_4_ = 0x7f800000;
        auVar127._16_4_ = 0x7f800000;
        auVar127._20_4_ = 0x7f800000;
        auVar127._24_4_ = 0x7f800000;
        auVar127._28_4_ = 0x7f800000;
        auVar128._8_4_ = 0xff800000;
        auVar128._0_8_ = 0xff800000ff800000;
        auVar128._12_4_ = 0xff800000;
        auVar128._16_4_ = 0xff800000;
        auVar128._20_4_ = 0xff800000;
        auVar128._24_4_ = 0xff800000;
        auVar128._28_4_ = 0xff800000;
      }
      else {
        auVar76 = vxorps_avx512vl(auVar82,auVar82);
        uVar71 = vcmpps_avx512vl(auVar98,ZEXT1232(ZEXT812(0)) << 0x20,5);
        auVar98 = vsqrtps_avx(auVar98);
        auVar85 = vfnmadd213ps_avx512vl(auVar116,local_760,auVar121);
        auVar100 = vfmadd132ps_avx512vl(auVar85,local_760,local_760);
        auVar85 = vsubps_avx(local_5e0,auVar98);
        auVar105 = vmulps_avx512vl(auVar85,auVar100);
        auVar98 = vsubps_avx512vl(auVar98,auVar113);
        auVar100 = vmulps_avx512vl(auVar98,auVar100);
        auVar98 = vfmadd213ps_avx512vl(auVar115,auVar105,auVar104);
        auVar51._4_4_ = fVar168 * auVar98._4_4_;
        auVar51._0_4_ = fVar155 * auVar98._0_4_;
        auVar51._8_4_ = fVar169 * auVar98._8_4_;
        auVar51._12_4_ = fVar170 * auVar98._12_4_;
        auVar51._16_4_ = fVar172 * auVar98._16_4_;
        auVar51._20_4_ = fVar171 * auVar98._20_4_;
        auVar51._24_4_ = fVar199 * auVar98._24_4_;
        auVar51._28_4_ = auVar86._28_4_;
        auVar98 = vmulps_avx512vl(local_540,auVar105);
        auVar85 = vmulps_avx512vl(local_560,auVar105);
        auVar106 = vmulps_avx512vl(_local_580,auVar105);
        auVar86 = vfmadd213ps_avx512vl(auVar87,auVar51,auVar220);
        auVar98 = vsubps_avx512vl(auVar98,auVar86);
        auVar86 = vfmadd213ps_avx512vl(auVar88,auVar51,auVar102);
        auVar86 = vsubps_avx512vl(auVar85,auVar86);
        auVar73 = vfmadd213ps_fma(auVar51,auVar99,auVar103);
        auVar85 = vsubps_avx(auVar106,ZEXT1632(auVar73));
        auVar245 = auVar85._0_28_;
        auVar85 = vfmadd213ps_avx512vl(auVar115,auVar100,auVar104);
        auVar101 = vmulps_avx512vl(auVar101,auVar85);
        auVar255 = ZEXT3264(auVar101);
        auVar85 = vmulps_avx512vl(local_540,auVar100);
        auVar104 = vmulps_avx512vl(local_560,auVar100);
        auVar106 = vmulps_avx512vl(_local_580,auVar100);
        auVar73 = vfmadd213ps_fma(auVar87,auVar101,auVar220);
        auVar85 = vsubps_avx(auVar85,ZEXT1632(auVar73));
        auVar73 = vfmadd213ps_fma(auVar88,auVar101,auVar102);
        auVar87 = vsubps_avx512vl(auVar104,ZEXT1632(auVar73));
        auVar73 = vfmadd213ps_fma(auVar99,auVar101,auVar103);
        auVar88 = vsubps_avx512vl(auVar106,ZEXT1632(auVar73));
        auVar237 = ZEXT3264(auVar88);
        auVar196._8_4_ = 0x7f800000;
        auVar196._0_8_ = 0x7f8000007f800000;
        auVar196._12_4_ = 0x7f800000;
        auVar196._16_4_ = 0x7f800000;
        auVar196._20_4_ = 0x7f800000;
        auVar196._24_4_ = 0x7f800000;
        auVar196._28_4_ = 0x7f800000;
        auVar88 = vblendmps_avx512vl(auVar196,auVar105);
        bVar68 = (bool)((byte)uVar71 & 1);
        auVar127._0_4_ = (uint)bVar68 * auVar88._0_4_ | (uint)!bVar68 * 0x7f800000;
        bVar68 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar127._4_4_ = (uint)bVar68 * auVar88._4_4_ | (uint)!bVar68 * 0x7f800000;
        bVar68 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar127._8_4_ = (uint)bVar68 * auVar88._8_4_ | (uint)!bVar68 * 0x7f800000;
        bVar68 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar127._12_4_ = (uint)bVar68 * auVar88._12_4_ | (uint)!bVar68 * 0x7f800000;
        bVar68 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar127._16_4_ = (uint)bVar68 * auVar88._16_4_ | (uint)!bVar68 * 0x7f800000;
        bVar68 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar127._20_4_ = (uint)bVar68 * auVar88._20_4_ | (uint)!bVar68 * 0x7f800000;
        bVar68 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar127._24_4_ = (uint)bVar68 * auVar88._24_4_ | (uint)!bVar68 * 0x7f800000;
        bVar68 = SUB81(uVar71 >> 7,0);
        auVar127._28_4_ = (uint)bVar68 * auVar88._28_4_ | (uint)!bVar68 * 0x7f800000;
        auVar221._8_4_ = 0xff800000;
        auVar221._0_8_ = 0xff800000ff800000;
        auVar221._12_4_ = 0xff800000;
        auVar221._16_4_ = 0xff800000;
        auVar221._20_4_ = 0xff800000;
        auVar221._24_4_ = 0xff800000;
        auVar221._28_4_ = 0xff800000;
        auVar88 = vblendmps_avx512vl(auVar221,auVar100);
        bVar68 = (bool)((byte)uVar71 & 1);
        auVar128._0_4_ = (uint)bVar68 * auVar88._0_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar71 >> 1) & 1);
        auVar128._4_4_ = (uint)bVar68 * auVar88._4_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar71 >> 2) & 1);
        auVar128._8_4_ = (uint)bVar68 * auVar88._8_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar71 >> 3) & 1);
        auVar128._12_4_ = (uint)bVar68 * auVar88._12_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar71 >> 4) & 1);
        auVar128._16_4_ = (uint)bVar68 * auVar88._16_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar71 >> 5) & 1);
        auVar128._20_4_ = (uint)bVar68 * auVar88._20_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = (bool)((byte)(uVar71 >> 6) & 1);
        auVar128._24_4_ = (uint)bVar68 * auVar88._24_4_ | (uint)!bVar68 * -0x800000;
        bVar68 = SUB81(uVar71 >> 7,0);
        auVar128._28_4_ = (uint)bVar68 * auVar88._28_4_ | (uint)!bVar68 * -0x800000;
        auVar33._8_4_ = 0x36000000;
        auVar33._0_8_ = 0x3600000036000000;
        auVar33._12_4_ = 0x36000000;
        auVar33._16_4_ = 0x36000000;
        auVar33._20_4_ = 0x36000000;
        auVar33._24_4_ = 0x36000000;
        auVar33._28_4_ = 0x36000000;
        auVar88 = vmulps_avx512vl(local_600,auVar33);
        uVar65 = vcmpps_avx512vl(auVar88,local_620,0xe);
        uVar71 = uVar71 & uVar65;
        bVar63 = (byte)uVar71;
        if (bVar63 != 0) {
          uVar65 = vcmpps_avx512vl(auVar97,ZEXT1632(auVar76),2);
          auVar242._8_4_ = 0x7f800000;
          auVar242._0_8_ = 0x7f8000007f800000;
          auVar242._12_4_ = 0x7f800000;
          auVar242._16_4_ = 0x7f800000;
          auVar242._20_4_ = 0x7f800000;
          auVar242._24_4_ = 0x7f800000;
          auVar242._28_4_ = 0x7f800000;
          auVar248._8_4_ = 0xff800000;
          auVar248._0_8_ = 0xff800000ff800000;
          auVar248._12_4_ = 0xff800000;
          auVar248._16_4_ = 0xff800000;
          auVar248._20_4_ = 0xff800000;
          auVar248._24_4_ = 0xff800000;
          auVar248._28_4_ = 0xff800000;
          auVar97 = vblendmps_avx512vl(auVar242,auVar248);
          bVar59 = (byte)uVar65;
          uVar72 = (uint)(bVar59 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar88._0_4_;
          bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
          uVar134 = (uint)bVar68 * auVar97._4_4_ | (uint)!bVar68 * auVar88._4_4_;
          bVar68 = (bool)((byte)(uVar65 >> 2) & 1);
          uVar135 = (uint)bVar68 * auVar97._8_4_ | (uint)!bVar68 * auVar88._8_4_;
          bVar68 = (bool)((byte)(uVar65 >> 3) & 1);
          uVar136 = (uint)bVar68 * auVar97._12_4_ | (uint)!bVar68 * auVar88._12_4_;
          bVar68 = (bool)((byte)(uVar65 >> 4) & 1);
          uVar137 = (uint)bVar68 * auVar97._16_4_ | (uint)!bVar68 * auVar88._16_4_;
          bVar68 = (bool)((byte)(uVar65 >> 5) & 1);
          uVar138 = (uint)bVar68 * auVar97._20_4_ | (uint)!bVar68 * auVar88._20_4_;
          bVar68 = (bool)((byte)(uVar65 >> 6) & 1);
          uVar139 = (uint)bVar68 * auVar97._24_4_ | (uint)!bVar68 * auVar88._24_4_;
          bVar68 = SUB81(uVar65 >> 7,0);
          uVar140 = (uint)bVar68 * auVar97._28_4_ | (uint)!bVar68 * auVar88._28_4_;
          auVar127._0_4_ = (bVar63 & 1) * uVar72 | !(bool)(bVar63 & 1) * auVar127._0_4_;
          bVar68 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar127._4_4_ = bVar68 * uVar134 | !bVar68 * auVar127._4_4_;
          bVar68 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar127._8_4_ = bVar68 * uVar135 | !bVar68 * auVar127._8_4_;
          bVar68 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar127._12_4_ = bVar68 * uVar136 | !bVar68 * auVar127._12_4_;
          bVar68 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar127._16_4_ = bVar68 * uVar137 | !bVar68 * auVar127._16_4_;
          bVar68 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar127._20_4_ = bVar68 * uVar138 | !bVar68 * auVar127._20_4_;
          bVar68 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar127._24_4_ = bVar68 * uVar139 | !bVar68 * auVar127._24_4_;
          bVar68 = SUB81(uVar71 >> 7,0);
          auVar127._28_4_ = bVar68 * uVar140 | !bVar68 * auVar127._28_4_;
          auVar97 = vblendmps_avx512vl(auVar248,auVar242);
          bVar68 = (bool)((byte)(uVar65 >> 1) & 1);
          bVar8 = (bool)((byte)(uVar65 >> 2) & 1);
          bVar9 = (bool)((byte)(uVar65 >> 3) & 1);
          bVar10 = (bool)((byte)(uVar65 >> 4) & 1);
          bVar11 = (bool)((byte)(uVar65 >> 5) & 1);
          bVar12 = (bool)((byte)(uVar65 >> 6) & 1);
          bVar13 = SUB81(uVar65 >> 7,0);
          auVar128._0_4_ =
               (uint)(bVar63 & 1) *
               ((uint)(bVar59 & 1) * auVar97._0_4_ | !(bool)(bVar59 & 1) * uVar72) |
               !(bool)(bVar63 & 1) * auVar128._0_4_;
          bVar7 = (bool)((byte)(uVar71 >> 1) & 1);
          auVar128._4_4_ =
               (uint)bVar7 * ((uint)bVar68 * auVar97._4_4_ | !bVar68 * uVar134) |
               !bVar7 * auVar128._4_4_;
          bVar68 = (bool)((byte)(uVar71 >> 2) & 1);
          auVar128._8_4_ =
               (uint)bVar68 * ((uint)bVar8 * auVar97._8_4_ | !bVar8 * uVar135) |
               !bVar68 * auVar128._8_4_;
          bVar68 = (bool)((byte)(uVar71 >> 3) & 1);
          auVar128._12_4_ =
               (uint)bVar68 * ((uint)bVar9 * auVar97._12_4_ | !bVar9 * uVar136) |
               !bVar68 * auVar128._12_4_;
          bVar68 = (bool)((byte)(uVar71 >> 4) & 1);
          auVar128._16_4_ =
               (uint)bVar68 * ((uint)bVar10 * auVar97._16_4_ | !bVar10 * uVar137) |
               !bVar68 * auVar128._16_4_;
          bVar68 = (bool)((byte)(uVar71 >> 5) & 1);
          auVar128._20_4_ =
               (uint)bVar68 * ((uint)bVar11 * auVar97._20_4_ | !bVar11 * uVar138) |
               !bVar68 * auVar128._20_4_;
          bVar68 = (bool)((byte)(uVar71 >> 6) & 1);
          auVar128._24_4_ =
               (uint)bVar68 * ((uint)bVar12 * auVar97._24_4_ | !bVar12 * uVar139) |
               !bVar68 * auVar128._24_4_;
          bVar68 = SUB81(uVar71 >> 7,0);
          auVar128._28_4_ =
               (uint)bVar68 * ((uint)bVar13 * auVar97._28_4_ | !bVar13 * uVar140) |
               !bVar68 * auVar128._28_4_;
          bVar66 = (~bVar63 | bVar59) & bVar66;
        }
      }
      auVar241._0_4_ = (float)local_580._0_4_ * auVar237._0_4_;
      auVar241._4_4_ = (float)local_580._4_4_ * auVar237._4_4_;
      auVar241._8_4_ = fStack_578 * auVar237._8_4_;
      auVar241._12_4_ = fStack_574 * auVar237._12_4_;
      auVar241._16_4_ = fStack_570 * auVar237._16_4_;
      auVar241._20_4_ = fStack_56c * auVar237._20_4_;
      auVar241._28_36_ = auVar237._28_36_;
      auVar241._24_4_ = fStack_568 * auVar237._24_4_;
      auVar73 = vfmadd231ps_fma(auVar241._0_32_,local_560,auVar87);
      auVar73 = vfmadd231ps_fma(ZEXT1632(auVar73),local_540,auVar85);
      auVar240._8_4_ = 0x7fffffff;
      auVar240._0_8_ = 0x7fffffff7fffffff;
      auVar240._12_4_ = 0x7fffffff;
      auVar240._16_4_ = 0x7fffffff;
      auVar240._20_4_ = 0x7fffffff;
      auVar240._24_4_ = 0x7fffffff;
      auVar240._28_4_ = 0x7fffffff;
      auVar97 = vandps_avx(ZEXT1632(auVar73),auVar240);
      _local_1c0 = local_520;
      auVar236._8_4_ = 0x3e99999a;
      auVar236._0_8_ = 0x3e99999a3e99999a;
      auVar236._12_4_ = 0x3e99999a;
      auVar236._16_4_ = 0x3e99999a;
      auVar236._20_4_ = 0x3e99999a;
      auVar236._24_4_ = 0x3e99999a;
      auVar236._28_4_ = 0x3e99999a;
      uVar17 = vcmpps_avx512vl(auVar97,auVar236,1);
      _local_4e0 = vmaxps_avx(local_520,auVar128);
      _local_2e0 = _local_4e0;
      auVar97 = vminps_avx(local_2c0,auVar127);
      uVar19 = vcmpps_avx512vl(local_520,auVar97,2);
      bVar63 = (byte)uVar19 & bVar58;
      uVar18 = vcmpps_avx512vl(_local_4e0,local_2c0,2);
      if ((bVar58 & ((byte)uVar18 | (byte)uVar19)) == 0) {
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar258 = ZEXT3264(auVar97);
        auVar232 = ZEXT3264(_DAT_01f7b040);
        auVar256 = ZEXT3264(local_7c0);
        auVar249 = ZEXT3264(local_7e0);
        auVar252 = ZEXT3264(local_800);
        auVar241 = ZEXT3264(local_820);
        auVar246 = ZEXT3264(local_840);
        auVar237 = ZEXT3264(local_860);
        auVar243 = ZEXT3264(local_880);
      }
      else {
        bVar59 = (byte)uVar17 | ~bVar66;
        auVar52._4_4_ = (float)local_580._4_4_ * auVar245._4_4_;
        auVar52._0_4_ = (float)local_580._0_4_ * auVar245._0_4_;
        auVar52._8_4_ = fStack_578 * auVar245._8_4_;
        auVar52._12_4_ = fStack_574 * auVar245._12_4_;
        auVar52._16_4_ = fStack_570 * auVar245._16_4_;
        auVar52._20_4_ = fStack_56c * auVar245._20_4_;
        auVar52._24_4_ = fStack_568 * auVar245._24_4_;
        auVar52._28_4_ = auVar97._28_4_;
        auVar73 = vfmadd213ps_fma(auVar86,local_560,auVar52);
        auVar73 = vfmadd213ps_fma(auVar98,local_540,ZEXT1632(auVar73));
        auVar97 = vandps_avx(ZEXT1632(auVar73),auVar240);
        uVar17 = vcmpps_avx512vl(auVar97,auVar236,1);
        bVar66 = (byte)uVar17 | ~bVar66;
        auVar150._8_4_ = 2;
        auVar150._0_8_ = 0x200000002;
        auVar150._12_4_ = 2;
        auVar150._16_4_ = 2;
        auVar150._20_4_ = 2;
        auVar150._24_4_ = 2;
        auVar150._28_4_ = 2;
        auVar34._8_4_ = 3;
        auVar34._0_8_ = 0x300000003;
        auVar34._12_4_ = 3;
        auVar34._16_4_ = 3;
        auVar34._20_4_ = 3;
        auVar34._24_4_ = 3;
        auVar34._28_4_ = 3;
        auVar97 = vpblendmd_avx512vl(auVar150,auVar34);
        local_2a0._0_4_ = (uint)(bVar66 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar66 & 1) * 2;
        bVar68 = (bool)(bVar66 >> 1 & 1);
        local_2a0._4_4_ = (uint)bVar68 * auVar97._4_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar66 >> 2 & 1);
        local_2a0._8_4_ = (uint)bVar68 * auVar97._8_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar66 >> 3 & 1);
        local_2a0._12_4_ = (uint)bVar68 * auVar97._12_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar66 >> 4 & 1);
        local_2a0._16_4_ = (uint)bVar68 * auVar97._16_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar66 >> 5 & 1);
        local_2a0._20_4_ = (uint)bVar68 * auVar97._20_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar66 >> 6 & 1);
        local_2a0._24_4_ = (uint)bVar68 * auVar97._24_4_ | (uint)!bVar68 * 2;
        local_2a0._28_4_ = (uint)(bVar66 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar66 >> 7) * 2;
        local_460 = vpbroadcastd_avx512vl();
        uVar17 = vpcmpd_avx512vl(local_460,local_2a0,5);
        local_4c0 = local_520._0_4_ + (float)local_500._0_4_;
        fStack_4bc = local_520._4_4_ + (float)local_500._4_4_;
        fStack_4b8 = local_520._8_4_ + fStack_4f8;
        fStack_4b4 = local_520._12_4_ + fStack_4f4;
        fStack_4b0 = local_520._16_4_ + fStack_4f0;
        fStack_4ac = local_520._20_4_ + fStack_4ec;
        fStack_4a8 = local_520._24_4_ + fStack_4e8;
        fStack_4a4 = local_520._28_4_ + fStack_4e4;
        for (bVar66 = (byte)uVar17 & bVar63; bVar66 != 0; bVar66 = ~bVar64 & bVar66 & (byte)uVar17)
        {
          auVar151._8_4_ = 0x7f800000;
          auVar151._0_8_ = 0x7f8000007f800000;
          auVar151._12_4_ = 0x7f800000;
          auVar151._16_4_ = 0x7f800000;
          auVar151._20_4_ = 0x7f800000;
          auVar151._24_4_ = 0x7f800000;
          auVar151._28_4_ = 0x7f800000;
          auVar97 = vblendmps_avx512vl(auVar151,local_520);
          auVar130._0_4_ =
               (uint)(bVar66 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar66 & 1) * 0x7f800000;
          bVar68 = (bool)(bVar66 >> 1 & 1);
          auVar130._4_4_ = (uint)bVar68 * auVar97._4_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)(bVar66 >> 2 & 1);
          auVar130._8_4_ = (uint)bVar68 * auVar97._8_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)(bVar66 >> 3 & 1);
          auVar130._12_4_ = (uint)bVar68 * auVar97._12_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)(bVar66 >> 4 & 1);
          auVar130._16_4_ = (uint)bVar68 * auVar97._16_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)(bVar66 >> 5 & 1);
          auVar130._20_4_ = (uint)bVar68 * auVar97._20_4_ | (uint)!bVar68 * 0x7f800000;
          auVar130._24_4_ =
               (uint)(bVar66 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar66 >> 6) * 0x7f800000;
          auVar130._28_4_ = 0x7f800000;
          auVar97 = vshufps_avx(auVar130,auVar130,0xb1);
          auVar97 = vminps_avx(auVar130,auVar97);
          auVar98 = vshufpd_avx(auVar97,auVar97,5);
          auVar97 = vminps_avx(auVar97,auVar98);
          auVar98 = vpermpd_avx2(auVar97,0x4e);
          auVar97 = vminps_avx(auVar97,auVar98);
          uVar17 = vcmpps_avx512vl(auVar130,auVar97,0);
          bVar60 = (byte)uVar17 & bVar66;
          bVar64 = bVar66;
          if (bVar60 != 0) {
            bVar64 = bVar60;
          }
          iVar20 = 0;
          for (uVar72 = (uint)bVar64; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
            iVar20 = iVar20 + 1;
          }
          bVar64 = '\x01' << ((byte)iVar20 & 0x1f);
          uVar72 = *(uint *)(local_1e0 + (uint)(iVar20 << 2));
          uVar134 = *(uint *)(local_1c0 + (uint)(iVar20 << 2));
          fVar155 = auVar15._0_4_;
          if ((float)local_7a0._0_4_ < 0.0) {
            auVar255 = ZEXT1664(auVar255._0_16_);
            fVar155 = sqrtf((float)local_7a0._0_4_);
          }
          uVar71 = (ulong)bVar64;
          auVar76 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar73 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar2 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar77 = vminps_avx(auVar76,auVar2);
          auVar76 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar2 = vmaxps_avx(auVar73,auVar76);
          auVar200._8_4_ = 0x7fffffff;
          auVar200._0_8_ = 0x7fffffff7fffffff;
          auVar200._12_4_ = 0x7fffffff;
          auVar73 = vandps_avx(auVar77,auVar200);
          auVar76 = vandps_avx(auVar2,auVar200);
          auVar73 = vmaxps_avx(auVar73,auVar76);
          auVar76 = vmovshdup_avx(auVar73);
          auVar76 = vmaxss_avx(auVar76,auVar73);
          auVar73 = vshufpd_avx(auVar73,auVar73,1);
          auVar73 = vmaxss_avx(auVar73,auVar76);
          fVar168 = auVar73._0_4_ * 1.9073486e-06;
          local_6f0 = vshufps_avx(auVar2,auVar2,0xff);
          auVar73 = vinsertps_avx(ZEXT416(uVar134),ZEXT416(uVar72),0x10);
          uVar65 = 0;
          while( true ) {
            bVar60 = (byte)uVar71;
            if (uVar65 == 5) break;
            uVar156 = auVar73._0_4_;
            auVar142._4_4_ = uVar156;
            auVar142._0_4_ = uVar156;
            auVar142._8_4_ = uVar156;
            auVar142._12_4_ = uVar156;
            auVar2 = vfmadd132ps_fma(auVar142,ZEXT816(0) << 0x40,local_790);
            auVar76 = vmovshdup_avx(auVar73);
            local_6c0._0_16_ = auVar76;
            fVar199 = 1.0 - auVar76._0_4_;
            auVar76 = vshufps_avx(auVar73,auVar73,0x55);
            fVar169 = auVar76._0_4_;
            auVar176._0_4_ = local_680._0_4_ * fVar169;
            fVar170 = auVar76._4_4_;
            auVar176._4_4_ = local_680._4_4_ * fVar170;
            fVar172 = auVar76._8_4_;
            auVar176._8_4_ = local_680._8_4_ * fVar172;
            fVar171 = auVar76._12_4_;
            auVar176._12_4_ = local_680._12_4_ * fVar171;
            _local_5c0 = ZEXT416((uint)fVar199);
            auVar201._4_4_ = fVar199;
            auVar201._0_4_ = fVar199;
            auVar201._8_4_ = fVar199;
            auVar201._12_4_ = fVar199;
            auVar76 = vfmadd231ps_fma(auVar176,auVar201,local_640._0_16_);
            auVar216._0_4_ = local_660._0_4_ * fVar169;
            auVar216._4_4_ = local_660._4_4_ * fVar170;
            auVar216._8_4_ = local_660._8_4_ * fVar172;
            auVar216._12_4_ = local_660._12_4_ * fVar171;
            auVar77 = vfmadd231ps_fma(auVar216,auVar201,local_680._0_16_);
            auVar225._0_4_ = fVar169 * (float)local_6a0._0_4_;
            auVar225._4_4_ = fVar170 * (float)local_6a0._4_4_;
            auVar225._8_4_ = fVar172 * fStack_698;
            auVar225._12_4_ = fVar171 * fStack_694;
            auVar83 = vfmadd231ps_fma(auVar225,auVar201,local_660._0_16_);
            auVar233._0_4_ = fVar169 * auVar77._0_4_;
            auVar233._4_4_ = fVar170 * auVar77._4_4_;
            auVar233._8_4_ = fVar172 * auVar77._8_4_;
            auVar233._12_4_ = fVar171 * auVar77._12_4_;
            auVar76 = vfmadd231ps_fma(auVar233,auVar201,auVar76);
            auVar177._0_4_ = fVar169 * auVar83._0_4_;
            auVar177._4_4_ = fVar170 * auVar83._4_4_;
            auVar177._8_4_ = fVar172 * auVar83._8_4_;
            auVar177._12_4_ = fVar171 * auVar83._12_4_;
            auVar77 = vfmadd231ps_fma(auVar177,auVar201,auVar77);
            auVar217._0_4_ = fVar169 * auVar77._0_4_;
            auVar217._4_4_ = fVar170 * auVar77._4_4_;
            auVar217._8_4_ = fVar172 * auVar77._8_4_;
            auVar217._12_4_ = fVar171 * auVar77._12_4_;
            auVar83 = vfmadd231ps_fma(auVar217,auVar76,auVar201);
            auVar76 = vsubps_avx(auVar77,auVar76);
            auVar22._8_4_ = 0x40400000;
            auVar22._0_8_ = 0x4040000040400000;
            auVar22._12_4_ = 0x40400000;
            auVar77 = vmulps_avx512vl(auVar76,auVar22);
            local_5a0._0_16_ = auVar83;
            auVar2 = vsubps_avx(auVar2,auVar83);
            auVar76 = vdpps_avx(auVar2,auVar2,0x7f);
            fVar169 = auVar76._0_4_;
            local_740 = ZEXT1632(auVar73);
            if (fVar169 < 0.0) {
              auVar243._0_4_ = sqrtf(fVar169);
              auVar243._4_60_ = extraout_var;
              auVar73 = auVar243._0_16_;
              uVar71 = extraout_RAX;
            }
            else {
              auVar73 = vsqrtss_avx(auVar76,auVar76);
            }
            local_5e0._0_16_ = vdpps_avx(auVar77,auVar77,0x7f);
            fVar170 = local_5e0._0_4_;
            auVar178._4_12_ = ZEXT812(0) << 0x20;
            auVar178._0_4_ = fVar170;
            local_760._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
            fVar172 = local_760._0_4_;
            local_600._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar178);
            auVar23._8_4_ = 0x80000000;
            auVar23._0_8_ = 0x8000000080000000;
            auVar23._12_4_ = 0x80000000;
            auVar74 = vxorps_avx512vl(local_5e0._0_16_,auVar23);
            auVar83 = vfnmadd213ss_fma(local_600._0_16_,local_5e0._0_16_,ZEXT416(0x40000000));
            local_620._0_4_ = auVar83._0_4_;
            local_780._0_4_ = auVar73._0_4_;
            if (fVar170 < auVar74._0_4_) {
              fVar171 = sqrtf(fVar170);
              auVar73 = ZEXT416((uint)local_780._0_4_);
              uVar71 = extraout_RAX_00;
            }
            else {
              auVar83 = vsqrtss_avx(local_5e0._0_16_,local_5e0._0_16_);
              fVar171 = auVar83._0_4_;
            }
            fVar199 = local_760._0_4_;
            fVar170 = fVar172 * 1.5 + fVar170 * -0.5 * fVar199 * fVar199 * fVar199;
            local_760._0_4_ = auVar77._0_4_ * fVar170;
            local_760._4_4_ = auVar77._4_4_ * fVar170;
            local_760._8_4_ = auVar77._8_4_ * fVar170;
            local_760._12_4_ = auVar77._12_4_ * fVar170;
            auVar83 = vdpps_avx(auVar2,local_760._0_16_,0x7f);
            fVar173 = auVar73._0_4_;
            fVar172 = auVar83._0_4_;
            auVar143._0_4_ = fVar172 * fVar172;
            auVar143._4_4_ = auVar83._4_4_ * auVar83._4_4_;
            auVar143._8_4_ = auVar83._8_4_ * auVar83._8_4_;
            auVar143._12_4_ = auVar83._12_4_ * auVar83._12_4_;
            auVar78 = vsubps_avx512vl(auVar76,auVar143);
            fVar199 = auVar78._0_4_;
            auVar158._4_12_ = ZEXT812(0) << 0x20;
            auVar158._0_4_ = fVar199;
            auVar74 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar158);
            auVar79 = vmulss_avx512f(auVar74,ZEXT416(0x3fc00000));
            auVar80 = vmulss_avx512f(auVar78,ZEXT416(0xbf000000));
            if (fVar199 < 0.0) {
              local_6e0 = fVar170;
              fStack_6dc = fVar170;
              fStack_6d8 = fVar170;
              fStack_6d4 = fVar170;
              local_6d0 = auVar74;
              fVar199 = sqrtf(fVar199);
              auVar80 = ZEXT416(auVar80._0_4_);
              auVar79 = ZEXT416(auVar79._0_4_);
              auVar73 = ZEXT416((uint)local_780._0_4_);
              uVar71 = extraout_RAX_01;
              auVar74 = local_6d0;
              fVar170 = local_6e0;
              fVar244 = fStack_6dc;
              fVar175 = fStack_6d8;
              fVar250 = fStack_6d4;
            }
            else {
              auVar78 = vsqrtss_avx(auVar78,auVar78);
              fVar199 = auVar78._0_4_;
              fVar244 = fVar170;
              fVar175 = fVar170;
              fVar250 = fVar170;
            }
            auVar255 = ZEXT1664(auVar74);
            auVar224 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_5c0,local_6c0._0_16_);
            auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_6c0._0_16_,_local_5c0);
            fVar174 = auVar78._0_4_ * 6.0;
            fVar16 = local_6c0._0_4_ * 6.0;
            auVar202._0_4_ = fVar16 * (float)local_6a0._0_4_;
            auVar202._4_4_ = fVar16 * (float)local_6a0._4_4_;
            auVar202._8_4_ = fVar16 * fStack_698;
            auVar202._12_4_ = fVar16 * fStack_694;
            auVar179._4_4_ = fVar174;
            auVar179._0_4_ = fVar174;
            auVar179._8_4_ = fVar174;
            auVar179._12_4_ = fVar174;
            auVar78 = vfmadd132ps_fma(auVar179,auVar202,local_660._0_16_);
            fVar174 = auVar224._0_4_ * 6.0;
            auVar159._4_4_ = fVar174;
            auVar159._0_4_ = fVar174;
            auVar159._8_4_ = fVar174;
            auVar159._12_4_ = fVar174;
            auVar78 = vfmadd132ps_fma(auVar159,auVar78,local_680._0_16_);
            fVar174 = local_5c0._0_4_ * 6.0;
            auVar180._4_4_ = fVar174;
            auVar180._0_4_ = fVar174;
            auVar180._8_4_ = fVar174;
            auVar180._12_4_ = fVar174;
            auVar78 = vfmadd132ps_fma(auVar180,auVar78,local_640._0_16_);
            auVar160._0_4_ = auVar78._0_4_ * (float)local_5e0._0_4_;
            auVar160._4_4_ = auVar78._4_4_ * (float)local_5e0._0_4_;
            auVar160._8_4_ = auVar78._8_4_ * (float)local_5e0._0_4_;
            auVar160._12_4_ = auVar78._12_4_ * (float)local_5e0._0_4_;
            auVar78 = vdpps_avx(auVar77,auVar78,0x7f);
            fVar174 = auVar78._0_4_;
            auVar181._0_4_ = auVar77._0_4_ * fVar174;
            auVar181._4_4_ = auVar77._4_4_ * fVar174;
            auVar181._8_4_ = auVar77._8_4_ * fVar174;
            auVar181._12_4_ = auVar77._12_4_ * fVar174;
            auVar78 = vsubps_avx(auVar160,auVar181);
            fVar174 = (float)local_620._0_4_ * (float)local_600._0_4_;
            auVar224 = vmaxss_avx(ZEXT416((uint)fVar168),
                                  ZEXT416((uint)(local_740._0_4_ * fVar155 * 1.9073486e-06)));
            auVar24._8_4_ = 0x80000000;
            auVar24._0_8_ = 0x8000000080000000;
            auVar24._12_4_ = 0x80000000;
            auVar132._16_16_ = auVar96._16_16_;
            auVar81 = vxorps_avx512vl(auVar77,auVar24);
            auVar182._0_4_ = fVar170 * auVar78._0_4_ * fVar174;
            auVar182._4_4_ = fVar244 * auVar78._4_4_ * fVar174;
            auVar182._8_4_ = fVar175 * auVar78._8_4_ * fVar174;
            auVar182._12_4_ = fVar250 * auVar78._12_4_ * fVar174;
            auVar78 = vdpps_avx(auVar81,local_760._0_16_,0x7f);
            auVar84 = vfmadd213ss_fma(auVar73,ZEXT416((uint)fVar168),auVar224);
            auVar73 = vdpps_avx(auVar2,auVar182,0x7f);
            auVar84 = vfmadd213ss_fma(ZEXT416((uint)(fVar173 + 1.0)),
                                      ZEXT416((uint)(fVar168 / fVar171)),auVar84);
            fVar170 = auVar78._0_4_ + auVar73._0_4_;
            auVar73 = vdpps_avx(local_790,local_760._0_16_,0x7f);
            auVar78 = vdpps_avx(auVar2,auVar81,0x7f);
            auVar80 = vmulss_avx512f(auVar80,auVar74);
            auVar82 = vaddss_avx512f(auVar79,ZEXT416((uint)(auVar80._0_4_ *
                                                           auVar74._0_4_ * auVar74._0_4_)));
            auVar79 = vdpps_avx(auVar2,local_790,0x7f);
            auVar81 = vfnmadd231ss_fma(auVar78,auVar83,ZEXT416((uint)fVar170));
            auVar79 = vfnmadd231ss_fma(auVar79,auVar83,auVar73);
            auVar78 = vpermilps_avx(local_5a0._0_16_,0xff);
            fVar199 = fVar199 - auVar78._0_4_;
            auVar80 = vshufps_avx(auVar77,auVar77,0xff);
            auVar78 = vfmsub213ss_fma(auVar81,auVar82,auVar80);
            auVar238._0_8_ = auVar78._0_8_ ^ 0x8000000080000000;
            auVar238._8_4_ = auVar78._8_4_ ^ 0x80000000;
            auVar238._12_4_ = auVar78._12_4_ ^ 0x80000000;
            auVar79 = ZEXT416((uint)(auVar79._0_4_ * auVar82._0_4_));
            auVar81 = vfmsub231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar78._0_4_)),
                                      ZEXT416((uint)fVar170),auVar79);
            auVar78 = vinsertps_avx(auVar238,auVar79,0x1c);
            auVar226._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
            auVar226._8_4_ = auVar73._8_4_ ^ 0x80000000;
            auVar226._12_4_ = auVar73._12_4_ ^ 0x80000000;
            auVar79 = vinsertps_avx(ZEXT416((uint)fVar170),auVar226,0x10);
            auVar203._0_4_ = auVar81._0_4_;
            auVar203._4_4_ = auVar203._0_4_;
            auVar203._8_4_ = auVar203._0_4_;
            auVar203._12_4_ = auVar203._0_4_;
            auVar73 = vdivps_avx(auVar78,auVar203);
            auVar78 = vdivps_avx(auVar79,auVar203);
            auVar204._0_4_ = fVar172 * auVar73._0_4_ + fVar199 * auVar78._0_4_;
            auVar204._4_4_ = fVar172 * auVar73._4_4_ + fVar199 * auVar78._4_4_;
            auVar204._8_4_ = fVar172 * auVar73._8_4_ + fVar199 * auVar78._8_4_;
            auVar204._12_4_ = fVar172 * auVar73._12_4_ + fVar199 * auVar78._12_4_;
            auVar73 = vsubps_avx(local_740._0_16_,auVar204);
            auVar25._8_4_ = 0x7fffffff;
            auVar25._0_8_ = 0x7fffffff7fffffff;
            auVar25._12_4_ = 0x7fffffff;
            auVar83 = vandps_avx512vl(auVar83,auVar25);
            if (auVar83._0_4_ < auVar84._0_4_) {
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(auVar84._0_4_ + auVar224._0_4_)),local_6f0,
                                        ZEXT416(0x36000000));
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar78 = vandps_avx512vl(ZEXT416((uint)fVar199),auVar26);
              if (auVar78._0_4_ < auVar83._0_4_) {
                bVar68 = uVar65 < 5;
                fVar155 = auVar73._0_4_ + (float)local_700._0_4_;
                if (fVar155 < fVar1) {
LAB_01a1241f:
                  bVar60 = 0;
                  goto LAB_01a12427;
                }
                fVar168 = *(float *)(ray + k * 4 + 0x100);
                if (fVar155 <= fVar168) {
                  auVar83 = vmovshdup_avx(auVar73);
                  bVar60 = 0;
                  if ((auVar83._0_4_ < 0.0) || (1.0 < auVar83._0_4_)) goto LAB_01a12427;
                  auVar205._0_12_ = ZEXT812(0);
                  auVar205._12_4_ = 0;
                  auVar132._0_16_ = auVar205;
                  auVar131._4_28_ = auVar132._4_28_;
                  auVar131._0_4_ = fVar169;
                  auVar83 = vrsqrt14ss_avx512f(auVar205,auVar131._0_16_);
                  fVar169 = auVar83._0_4_;
                  auVar76 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
                  pGVar4 = (context->scene->geometries).items[uVar3].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01a1241f;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar60 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01a12427;
                  fVar169 = fVar169 * 1.5 + auVar76._0_4_ * fVar169 * fVar169 * fVar169;
                  auVar183._0_4_ = auVar2._0_4_ * fVar169;
                  auVar183._4_4_ = auVar2._4_4_ * fVar169;
                  auVar183._8_4_ = auVar2._8_4_ * fVar169;
                  auVar183._12_4_ = auVar2._12_4_ * fVar169;
                  auVar83 = vfmadd213ps_fma(auVar80,auVar183,auVar77);
                  auVar76 = vshufps_avx(auVar183,auVar183,0xc9);
                  auVar2 = vshufps_avx(auVar77,auVar77,0xc9);
                  auVar184._0_4_ = auVar183._0_4_ * auVar2._0_4_;
                  auVar184._4_4_ = auVar183._4_4_ * auVar2._4_4_;
                  auVar184._8_4_ = auVar183._8_4_ * auVar2._8_4_;
                  auVar184._12_4_ = auVar183._12_4_ * auVar2._12_4_;
                  auVar77 = vfmsub231ps_fma(auVar184,auVar77,auVar76);
                  auVar76 = vshufps_avx(auVar77,auVar77,0xc9);
                  auVar2 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar77 = vshufps_avx(auVar77,auVar77,0xd2);
                  auVar144._0_4_ = auVar83._0_4_ * auVar77._0_4_;
                  auVar144._4_4_ = auVar83._4_4_ * auVar77._4_4_;
                  auVar144._8_4_ = auVar83._8_4_ * auVar77._8_4_;
                  auVar144._12_4_ = auVar83._12_4_ * auVar77._12_4_;
                  auVar76 = vfmsub231ps_fma(auVar144,auVar76,auVar2);
                  auVar213._8_4_ = 1;
                  auVar213._0_8_ = 0x100000001;
                  auVar213._12_4_ = 1;
                  auVar213._16_4_ = 1;
                  auVar213._20_4_ = 1;
                  auVar213._24_4_ = 1;
                  auVar213._28_4_ = 1;
                  local_3a0 = vpermps_avx2(auVar213,ZEXT1632(auVar73));
                  auVar97 = vpermps_avx2(auVar213,ZEXT1632(auVar76));
                  auVar222._8_4_ = 2;
                  auVar222._0_8_ = 0x200000002;
                  auVar222._12_4_ = 2;
                  auVar222._16_4_ = 2;
                  auVar222._20_4_ = 2;
                  auVar222._24_4_ = 2;
                  auVar222._28_4_ = 2;
                  local_3e0 = vpermps_avx2(auVar222,ZEXT1632(auVar76));
                  local_3c0 = auVar76._0_4_;
                  local_400[0] = (RTCHitN)auVar97[0];
                  local_400[1] = (RTCHitN)auVar97[1];
                  local_400[2] = (RTCHitN)auVar97[2];
                  local_400[3] = (RTCHitN)auVar97[3];
                  local_400[4] = (RTCHitN)auVar97[4];
                  local_400[5] = (RTCHitN)auVar97[5];
                  local_400[6] = (RTCHitN)auVar97[6];
                  local_400[7] = (RTCHitN)auVar97[7];
                  local_400[8] = (RTCHitN)auVar97[8];
                  local_400[9] = (RTCHitN)auVar97[9];
                  local_400[10] = (RTCHitN)auVar97[10];
                  local_400[0xb] = (RTCHitN)auVar97[0xb];
                  local_400[0xc] = (RTCHitN)auVar97[0xc];
                  local_400[0xd] = (RTCHitN)auVar97[0xd];
                  local_400[0xe] = (RTCHitN)auVar97[0xe];
                  local_400[0xf] = (RTCHitN)auVar97[0xf];
                  local_400[0x10] = (RTCHitN)auVar97[0x10];
                  local_400[0x11] = (RTCHitN)auVar97[0x11];
                  local_400[0x12] = (RTCHitN)auVar97[0x12];
                  local_400[0x13] = (RTCHitN)auVar97[0x13];
                  local_400[0x14] = (RTCHitN)auVar97[0x14];
                  local_400[0x15] = (RTCHitN)auVar97[0x15];
                  local_400[0x16] = (RTCHitN)auVar97[0x16];
                  local_400[0x17] = (RTCHitN)auVar97[0x17];
                  local_400[0x18] = (RTCHitN)auVar97[0x18];
                  local_400[0x19] = (RTCHitN)auVar97[0x19];
                  local_400[0x1a] = (RTCHitN)auVar97[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar97[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar97[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar97[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar97[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar97[0x1f];
                  uStack_3bc = local_3c0;
                  uStack_3b8 = local_3c0;
                  uStack_3b4 = local_3c0;
                  uStack_3b0 = local_3c0;
                  uStack_3ac = local_3c0;
                  uStack_3a8 = local_3c0;
                  uStack_3a4 = local_3c0;
                  local_380 = ZEXT432(0) << 0x20;
                  local_360 = local_420._0_8_;
                  uStack_358 = local_420._8_8_;
                  uStack_350 = local_420._16_8_;
                  uStack_348 = local_420._24_8_;
                  local_340 = local_440;
                  vpcmpeqd_avx2(local_440,local_440);
                  local_320 = context->user->instID[0];
                  uStack_31c = local_320;
                  uStack_318 = local_320;
                  uStack_314 = local_320;
                  uStack_310 = local_320;
                  uStack_30c = local_320;
                  uStack_308 = local_320;
                  uStack_304 = local_320;
                  local_300 = context->user->instPrimID[0];
                  uStack_2fc = local_300;
                  uStack_2f8 = local_300;
                  uStack_2f4 = local_300;
                  uStack_2f0 = local_300;
                  uStack_2ec = local_300;
                  uStack_2e8 = local_300;
                  uStack_2e4 = local_300;
                  *(float *)(ray + k * 4 + 0x100) = fVar155;
                  local_720 = local_480;
                  local_8b0.valid = (int *)local_720;
                  local_8b0.geometryUserPtr = pGVar4->userPtr;
                  local_8b0.context = context->user;
                  local_8b0.hit = local_400;
                  local_8b0.N = 8;
                  local_8b0.ray = (RTCRayN *)ray;
                  if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar255 = ZEXT1664(auVar74);
                    (*pGVar4->occlusionFilterN)(&local_8b0);
                  }
                  if (local_720 != (undefined1  [32])0x0) {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar255 = ZEXT1664(auVar255._0_16_);
                      (*p_Var6)(&local_8b0);
                    }
                    uVar71 = vptestmd_avx512vl(local_720,local_720);
                    auVar97 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar7 = (bool)((byte)uVar71 & 1);
                    bVar8 = (bool)((byte)(uVar71 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar71 >> 2) & 1);
                    bVar10 = (bool)((byte)(uVar71 >> 3) & 1);
                    bVar11 = (bool)((byte)(uVar71 >> 4) & 1);
                    bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
                    bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
                    bVar14 = SUB81(uVar71 >> 7,0);
                    *(uint *)(local_8b0.ray + 0x100) =
                         (uint)bVar7 * auVar97._0_4_ |
                         (uint)!bVar7 * *(int *)(local_8b0.ray + 0x100);
                    *(uint *)(local_8b0.ray + 0x104) =
                         (uint)bVar8 * auVar97._4_4_ |
                         (uint)!bVar8 * *(int *)(local_8b0.ray + 0x104);
                    *(uint *)(local_8b0.ray + 0x108) =
                         (uint)bVar9 * auVar97._8_4_ |
                         (uint)!bVar9 * *(int *)(local_8b0.ray + 0x108);
                    *(uint *)(local_8b0.ray + 0x10c) =
                         (uint)bVar10 * auVar97._12_4_ |
                         (uint)!bVar10 * *(int *)(local_8b0.ray + 0x10c);
                    *(uint *)(local_8b0.ray + 0x110) =
                         (uint)bVar11 * auVar97._16_4_ |
                         (uint)!bVar11 * *(int *)(local_8b0.ray + 0x110);
                    *(uint *)(local_8b0.ray + 0x114) =
                         (uint)bVar12 * auVar97._20_4_ |
                         (uint)!bVar12 * *(int *)(local_8b0.ray + 0x114);
                    *(uint *)(local_8b0.ray + 0x118) =
                         (uint)bVar13 * auVar97._24_4_ |
                         (uint)!bVar13 * *(int *)(local_8b0.ray + 0x118);
                    *(uint *)(local_8b0.ray + 0x11c) =
                         (uint)bVar14 * auVar97._28_4_ |
                         (uint)!bVar14 * *(int *)(local_8b0.ray + 0x11c);
                    bVar60 = 1;
                    if (local_720 != (undefined1  [32])0x0) goto LAB_01a12427;
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar168;
                }
                bVar60 = 0;
                goto LAB_01a12427;
              }
            }
            uVar65 = uVar65 + 1;
          }
          bVar68 = false;
LAB_01a12427:
          bVar61 = bVar61 | bVar68 & bVar60;
          uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar230._4_4_ = uVar156;
          auVar230._0_4_ = uVar156;
          auVar230._8_4_ = uVar156;
          auVar230._12_4_ = uVar156;
          auVar230._16_4_ = uVar156;
          auVar230._20_4_ = uVar156;
          auVar230._24_4_ = uVar156;
          auVar230._28_4_ = uVar156;
          auVar232 = ZEXT3264(auVar230);
          auVar54._4_4_ = fStack_4bc;
          auVar54._0_4_ = local_4c0;
          auVar54._8_4_ = fStack_4b8;
          auVar54._12_4_ = fStack_4b4;
          auVar54._16_4_ = fStack_4b0;
          auVar54._20_4_ = fStack_4ac;
          auVar54._24_4_ = fStack_4a8;
          auVar54._28_4_ = fStack_4a4;
          uVar17 = vcmpps_avx512vl(auVar230,auVar54,0xd);
        }
        auVar152._0_4_ = (float)local_500._0_4_ + (float)local_4e0._0_4_;
        auVar152._4_4_ = (float)local_500._4_4_ + (float)local_4e0._4_4_;
        auVar152._8_4_ = fStack_4f8 + fStack_4d8;
        auVar152._12_4_ = fStack_4f4 + fStack_4d4;
        auVar152._16_4_ = fStack_4f0 + fStack_4d0;
        auVar152._20_4_ = fStack_4ec + fStack_4cc;
        auVar152._24_4_ = fStack_4e8 + fStack_4c8;
        auVar152._28_4_ = fStack_4e4 + fStack_4c4;
        uVar156 = auVar232._0_4_;
        auVar166._4_4_ = uVar156;
        auVar166._0_4_ = uVar156;
        auVar166._8_4_ = uVar156;
        auVar166._12_4_ = uVar156;
        auVar166._16_4_ = uVar156;
        auVar166._20_4_ = uVar156;
        auVar166._24_4_ = uVar156;
        auVar166._28_4_ = uVar156;
        uVar17 = vcmpps_avx512vl(auVar152,auVar166,2);
        auVar153._8_4_ = 2;
        auVar153._0_8_ = 0x200000002;
        auVar153._12_4_ = 2;
        auVar153._16_4_ = 2;
        auVar153._20_4_ = 2;
        auVar153._24_4_ = 2;
        auVar153._28_4_ = 2;
        auVar35._8_4_ = 3;
        auVar35._0_8_ = 0x300000003;
        auVar35._12_4_ = 3;
        auVar35._16_4_ = 3;
        auVar35._20_4_ = 3;
        auVar35._24_4_ = 3;
        auVar35._28_4_ = 3;
        auVar97 = vpblendmd_avx512vl(auVar153,auVar35);
        local_4e0._0_4_ = (uint)(bVar59 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar59 & 1) * 2;
        bVar68 = (bool)(bVar59 >> 1 & 1);
        local_4e0._4_4_ = (uint)bVar68 * auVar97._4_4_ | (uint)!bVar68 * 2;
        bVar68 = (bool)(bVar59 >> 2 & 1);
        fStack_4d8 = (float)((uint)bVar68 * auVar97._8_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar59 >> 3 & 1);
        fStack_4d4 = (float)((uint)bVar68 * auVar97._12_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar59 >> 4 & 1);
        fStack_4d0 = (float)((uint)bVar68 * auVar97._16_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar59 >> 5 & 1);
        fStack_4cc = (float)((uint)bVar68 * auVar97._20_4_ | (uint)!bVar68 * 2);
        bVar68 = (bool)(bVar59 >> 6 & 1);
        fStack_4c8 = (float)((uint)bVar68 * auVar97._24_4_ | (uint)!bVar68 * 2);
        fStack_4c4 = (float)((uint)(bVar59 >> 7) * auVar97._28_4_ | (uint)!(bool)(bVar59 >> 7) * 2);
        bVar58 = (byte)uVar18 & bVar58 & (byte)uVar17;
        uVar17 = vpcmpd_avx512vl(_local_4e0,local_460,2);
        local_520 = _local_2e0;
        local_4c0 = (float)local_500._0_4_ + (float)local_2e0._0_4_;
        fStack_4bc = (float)local_500._4_4_ + (float)local_2e0._4_4_;
        fStack_4b8 = fStack_4f8 + fStack_2d8;
        fStack_4b4 = fStack_4f4 + fStack_2d4;
        fStack_4b0 = fStack_4f0 + fStack_2d0;
        fStack_4ac = fStack_4ec + fStack_2cc;
        fStack_4a8 = fStack_4e8 + fStack_2c8;
        fStack_4a4 = fStack_4e4 + fStack_2c4;
        auVar256 = ZEXT3264(local_7c0);
        auVar249 = ZEXT3264(local_7e0);
        auVar252 = ZEXT3264(local_800);
        auVar241 = ZEXT3264(local_820);
        auVar246 = ZEXT3264(local_840);
        auVar237 = ZEXT3264(local_860);
        auVar243 = ZEXT3264(local_880);
        for (bVar66 = (byte)uVar17 & bVar58; bVar66 != 0; bVar66 = ~bVar59 & bVar66 & (byte)uVar17)
        {
          auVar154._8_4_ = 0x7f800000;
          auVar154._0_8_ = 0x7f8000007f800000;
          auVar154._12_4_ = 0x7f800000;
          auVar154._16_4_ = 0x7f800000;
          auVar154._20_4_ = 0x7f800000;
          auVar154._24_4_ = 0x7f800000;
          auVar154._28_4_ = 0x7f800000;
          auVar97 = vblendmps_avx512vl(auVar154,local_520);
          auVar133._0_4_ =
               (uint)(bVar66 & 1) * auVar97._0_4_ | (uint)!(bool)(bVar66 & 1) * 0x7f800000;
          bVar68 = (bool)(bVar66 >> 1 & 1);
          auVar133._4_4_ = (uint)bVar68 * auVar97._4_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)(bVar66 >> 2 & 1);
          auVar133._8_4_ = (uint)bVar68 * auVar97._8_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)(bVar66 >> 3 & 1);
          auVar133._12_4_ = (uint)bVar68 * auVar97._12_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)(bVar66 >> 4 & 1);
          auVar133._16_4_ = (uint)bVar68 * auVar97._16_4_ | (uint)!bVar68 * 0x7f800000;
          bVar68 = (bool)(bVar66 >> 5 & 1);
          auVar133._20_4_ = (uint)bVar68 * auVar97._20_4_ | (uint)!bVar68 * 0x7f800000;
          auVar133._24_4_ =
               (uint)(bVar66 >> 6) * auVar97._24_4_ | (uint)!(bool)(bVar66 >> 6) * 0x7f800000;
          auVar133._28_4_ = 0x7f800000;
          auVar97 = vshufps_avx(auVar133,auVar133,0xb1);
          auVar97 = vminps_avx(auVar133,auVar97);
          auVar98 = vshufpd_avx(auVar97,auVar97,5);
          auVar97 = vminps_avx(auVar97,auVar98);
          auVar98 = vpermpd_avx2(auVar97,0x4e);
          auVar97 = vminps_avx(auVar97,auVar98);
          uVar17 = vcmpps_avx512vl(auVar133,auVar97,0);
          bVar64 = (byte)uVar17 & bVar66;
          bVar59 = bVar66;
          if (bVar64 != 0) {
            bVar59 = bVar64;
          }
          iVar20 = 0;
          for (uVar72 = (uint)bVar59; (uVar72 & 1) == 0; uVar72 = uVar72 >> 1 | 0x80000000) {
            iVar20 = iVar20 + 1;
          }
          bVar59 = '\x01' << ((byte)iVar20 & 0x1f);
          uVar72 = *(uint *)(local_200 + (uint)(iVar20 << 2));
          uVar134 = *(uint *)(local_2c0 + (uint)(iVar20 << 2));
          fVar155 = auVar75._0_4_;
          if ((float)local_7a0._0_4_ < 0.0) {
            auVar255 = ZEXT1664(auVar255._0_16_);
            fVar155 = sqrtf((float)local_7a0._0_4_);
            auVar243 = ZEXT3264(local_880);
            auVar237 = ZEXT3264(local_860);
            auVar246 = ZEXT3264(local_840);
            auVar241 = ZEXT3264(local_820);
            auVar252 = ZEXT3264(local_800);
            auVar249 = ZEXT3264(local_7e0);
            auVar256 = ZEXT3264(local_7c0);
          }
          uVar71 = (ulong)bVar59;
          auVar76 = vminps_avx(local_640._0_16_,local_680._0_16_);
          auVar73 = vmaxps_avx(local_640._0_16_,local_680._0_16_);
          auVar2 = vminps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar77 = vminps_avx(auVar76,auVar2);
          auVar76 = vmaxps_avx(local_660._0_16_,local_6a0._0_16_);
          auVar2 = vmaxps_avx(auVar73,auVar76);
          auVar206._8_4_ = 0x7fffffff;
          auVar206._0_8_ = 0x7fffffff7fffffff;
          auVar206._12_4_ = 0x7fffffff;
          auVar73 = vandps_avx(auVar77,auVar206);
          auVar76 = vandps_avx(auVar2,auVar206);
          auVar73 = vmaxps_avx(auVar73,auVar76);
          auVar76 = vmovshdup_avx(auVar73);
          auVar76 = vmaxss_avx(auVar76,auVar73);
          auVar73 = vshufpd_avx(auVar73,auVar73,1);
          auVar73 = vmaxss_avx(auVar73,auVar76);
          fVar168 = auVar73._0_4_ * 1.9073486e-06;
          local_6f0 = vshufps_avx(auVar2,auVar2,0xff);
          auVar73 = vinsertps_avx(ZEXT416(uVar134),ZEXT416(uVar72),0x10);
          uVar65 = 0;
          while( true ) {
            bVar64 = (byte)uVar71;
            if (uVar65 == 5) break;
            uVar156 = auVar73._0_4_;
            auVar145._4_4_ = uVar156;
            auVar145._0_4_ = uVar156;
            auVar145._8_4_ = uVar156;
            auVar145._12_4_ = uVar156;
            auVar2 = vfmadd132ps_fma(auVar145,ZEXT816(0) << 0x40,local_790);
            auVar76 = vmovshdup_avx(auVar73);
            local_5e0._0_16_ = auVar76;
            fVar199 = 1.0 - auVar76._0_4_;
            auVar76 = vshufps_avx(auVar73,auVar73,0x55);
            fVar169 = auVar76._0_4_;
            auVar185._0_4_ = local_680._0_4_ * fVar169;
            fVar170 = auVar76._4_4_;
            auVar185._4_4_ = local_680._4_4_ * fVar170;
            fVar172 = auVar76._8_4_;
            auVar185._8_4_ = local_680._8_4_ * fVar172;
            fVar171 = auVar76._12_4_;
            auVar185._12_4_ = local_680._12_4_ * fVar171;
            _local_5c0 = ZEXT416((uint)fVar199);
            auVar207._4_4_ = fVar199;
            auVar207._0_4_ = fVar199;
            auVar207._8_4_ = fVar199;
            auVar207._12_4_ = fVar199;
            auVar76 = vfmadd231ps_fma(auVar185,auVar207,local_640._0_16_);
            auVar218._0_4_ = local_660._0_4_ * fVar169;
            auVar218._4_4_ = local_660._4_4_ * fVar170;
            auVar218._8_4_ = local_660._8_4_ * fVar172;
            auVar218._12_4_ = local_660._12_4_ * fVar171;
            auVar77 = vfmadd231ps_fma(auVar218,auVar207,local_680._0_16_);
            auVar227._0_4_ = fVar169 * (float)local_6a0._0_4_;
            auVar227._4_4_ = fVar170 * (float)local_6a0._4_4_;
            auVar227._8_4_ = fVar172 * fStack_698;
            auVar227._12_4_ = fVar171 * fStack_694;
            auVar83 = vfmadd231ps_fma(auVar227,auVar207,local_660._0_16_);
            auVar234._0_4_ = fVar169 * auVar77._0_4_;
            auVar234._4_4_ = fVar170 * auVar77._4_4_;
            auVar234._8_4_ = fVar172 * auVar77._8_4_;
            auVar234._12_4_ = fVar171 * auVar77._12_4_;
            auVar76 = vfmadd231ps_fma(auVar234,auVar207,auVar76);
            auVar186._0_4_ = fVar169 * auVar83._0_4_;
            auVar186._4_4_ = fVar170 * auVar83._4_4_;
            auVar186._8_4_ = fVar172 * auVar83._8_4_;
            auVar186._12_4_ = fVar171 * auVar83._12_4_;
            auVar77 = vfmadd231ps_fma(auVar186,auVar207,auVar77);
            auVar219._0_4_ = fVar169 * auVar77._0_4_;
            auVar219._4_4_ = fVar170 * auVar77._4_4_;
            auVar219._8_4_ = fVar172 * auVar77._8_4_;
            auVar219._12_4_ = fVar171 * auVar77._12_4_;
            auVar83 = vfmadd231ps_fma(auVar219,auVar76,auVar207);
            auVar76 = vsubps_avx(auVar77,auVar76);
            auVar27._8_4_ = 0x40400000;
            auVar27._0_8_ = 0x4040000040400000;
            auVar27._12_4_ = 0x40400000;
            auVar77 = vmulps_avx512vl(auVar76,auVar27);
            local_5a0._0_16_ = auVar83;
            auVar2 = vsubps_avx(auVar2,auVar83);
            auVar76 = vdpps_avx(auVar2,auVar2,0x7f);
            fVar169 = auVar76._0_4_;
            local_740 = ZEXT1632(auVar73);
            if (fVar169 < 0.0) {
              auVar246._0_4_ = sqrtf(fVar169);
              auVar246._4_60_ = extraout_var_00;
              auVar73 = auVar246._0_16_;
              uVar71 = extraout_RAX_02;
            }
            else {
              auVar73 = vsqrtss_avx(auVar76,auVar76);
            }
            local_600._0_16_ = vdpps_avx(auVar77,auVar77,0x7f);
            fVar170 = local_600._0_4_;
            auVar187._4_12_ = ZEXT812(0) << 0x20;
            auVar187._0_4_ = fVar170;
            local_780._0_16_ = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
            fVar172 = local_780._0_4_;
            local_620._0_16_ = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar187);
            auVar28._8_4_ = 0x80000000;
            auVar28._0_8_ = 0x8000000080000000;
            auVar28._12_4_ = 0x80000000;
            auVar74 = vxorps_avx512vl(local_600._0_16_,auVar28);
            auVar83 = vfnmadd213ss_fma(local_620._0_16_,local_600._0_16_,ZEXT416(0x40000000));
            local_760._0_4_ = auVar83._0_4_;
            local_6c0._0_4_ = auVar73._0_4_;
            if (fVar170 < auVar74._0_4_) {
              fVar171 = sqrtf(fVar170);
              auVar73 = ZEXT416((uint)local_6c0._0_4_);
              uVar71 = extraout_RAX_03;
            }
            else {
              auVar83 = vsqrtss_avx(local_600._0_16_,local_600._0_16_);
              fVar171 = auVar83._0_4_;
            }
            fVar199 = local_780._0_4_;
            fVar170 = fVar172 * 1.5 + fVar170 * -0.5 * fVar199 * fVar199 * fVar199;
            auVar146._0_4_ = auVar77._0_4_ * fVar170;
            auVar146._4_4_ = auVar77._4_4_ * fVar170;
            auVar146._8_4_ = auVar77._8_4_ * fVar170;
            auVar146._12_4_ = auVar77._12_4_ * fVar170;
            local_780._0_16_ = vdpps_avx(auVar2,auVar146,0x7f);
            auVar74 = vaddss_avx512f(auVar73,ZEXT416(0x3f800000));
            auVar147._0_4_ = local_780._0_4_ * local_780._0_4_;
            auVar147._4_4_ = local_780._4_4_ * local_780._4_4_;
            auVar147._8_4_ = local_780._8_4_ * local_780._8_4_;
            auVar147._12_4_ = local_780._12_4_ * local_780._12_4_;
            auVar76 = vsubps_avx(auVar76,auVar147);
            fVar172 = auVar76._0_4_;
            auVar161._4_12_ = ZEXT812(0) << 0x20;
            auVar161._0_4_ = fVar172;
            auVar83 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar161);
            auVar78 = vmulss_avx512f(auVar83,ZEXT416(0x3fc00000));
            auVar79 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
            uVar70 = fVar172 == 0.0;
            uVar69 = fVar172 < 0.0;
            if ((bool)uVar69) {
              local_6e0 = fVar170;
              fStack_6dc = fVar170;
              fStack_6d8 = fVar170;
              fStack_6d4 = fVar170;
              local_6d0 = auVar83;
              fVar172 = sqrtf(fVar172);
              auVar79 = ZEXT416(auVar79._0_4_);
              auVar78 = ZEXT416(auVar78._0_4_);
              auVar73 = ZEXT416((uint)local_6c0._0_4_);
              auVar74 = ZEXT416(auVar74._0_4_);
              uVar71 = extraout_RAX_04;
              auVar83 = local_6d0;
              fVar170 = local_6e0;
              fVar199 = fStack_6dc;
              fVar173 = fStack_6d8;
              fVar244 = fStack_6d4;
            }
            else {
              auVar76 = vsqrtss_avx(auVar76,auVar76);
              fVar172 = auVar76._0_4_;
              fVar199 = fVar170;
              fVar173 = fVar170;
              fVar244 = fVar170;
            }
            auVar255 = ZEXT1664(auVar2);
            auVar256 = ZEXT3264(local_7c0);
            auVar249 = ZEXT3264(local_7e0);
            auVar252 = ZEXT3264(local_800);
            auVar246 = ZEXT3264(local_840);
            auVar80 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),_local_5c0,local_5e0._0_16_);
            auVar76 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_5e0._0_16_,_local_5c0);
            fVar175 = auVar76._0_4_ * 6.0;
            fVar250 = local_5e0._0_4_ * 6.0;
            auVar208._0_4_ = fVar250 * (float)local_6a0._0_4_;
            auVar208._4_4_ = fVar250 * (float)local_6a0._4_4_;
            auVar208._8_4_ = fVar250 * fStack_698;
            auVar208._12_4_ = fVar250 * fStack_694;
            auVar188._4_4_ = fVar175;
            auVar188._0_4_ = fVar175;
            auVar188._8_4_ = fVar175;
            auVar188._12_4_ = fVar175;
            auVar76 = vfmadd132ps_fma(auVar188,auVar208,local_660._0_16_);
            fVar175 = auVar80._0_4_ * 6.0;
            auVar162._4_4_ = fVar175;
            auVar162._0_4_ = fVar175;
            auVar162._8_4_ = fVar175;
            auVar162._12_4_ = fVar175;
            auVar76 = vfmadd132ps_fma(auVar162,auVar76,local_680._0_16_);
            fVar175 = local_5c0._0_4_ * 6.0;
            auVar189._4_4_ = fVar175;
            auVar189._0_4_ = fVar175;
            auVar189._8_4_ = fVar175;
            auVar189._12_4_ = fVar175;
            auVar76 = vfmadd132ps_fma(auVar189,auVar76,local_640._0_16_);
            auVar163._0_4_ = auVar76._0_4_ * (float)local_600._0_4_;
            auVar163._4_4_ = auVar76._4_4_ * (float)local_600._0_4_;
            auVar163._8_4_ = auVar76._8_4_ * (float)local_600._0_4_;
            auVar163._12_4_ = auVar76._12_4_ * (float)local_600._0_4_;
            auVar76 = vdpps_avx(auVar77,auVar76,0x7f);
            fVar175 = auVar76._0_4_;
            auVar190._0_4_ = auVar77._0_4_ * fVar175;
            auVar190._4_4_ = auVar77._4_4_ * fVar175;
            auVar190._8_4_ = auVar77._8_4_ * fVar175;
            auVar190._12_4_ = auVar77._12_4_ * fVar175;
            auVar76 = vsubps_avx(auVar163,auVar190);
            fVar175 = (float)local_760._0_4_ * (float)local_620._0_4_;
            auVar80 = vmaxss_avx(ZEXT416((uint)fVar168),
                                 ZEXT416((uint)(local_740._0_4_ * fVar155 * 1.9073486e-06)));
            auVar29._8_4_ = 0x80000000;
            auVar29._0_8_ = 0x8000000080000000;
            auVar29._12_4_ = 0x80000000;
            auVar84 = vxorps_avx512vl(auVar77,auVar29);
            auVar191._0_4_ = fVar170 * auVar76._0_4_ * fVar175;
            auVar191._4_4_ = fVar199 * auVar76._4_4_ * fVar175;
            auVar191._8_4_ = fVar173 * auVar76._8_4_ * fVar175;
            auVar191._12_4_ = fVar244 * auVar76._12_4_ * fVar175;
            auVar76 = vdpps_avx(auVar84,auVar146,0x7f);
            auVar224 = vfmadd213ss_fma(auVar73,ZEXT416((uint)fVar168),auVar80);
            auVar73 = vdpps_avx(auVar2,auVar191,0x7f);
            vfmadd213ss_avx512f(auVar74,ZEXT416((uint)(fVar168 / fVar171)),auVar224);
            fVar170 = auVar76._0_4_ + auVar73._0_4_;
            auVar73 = vdpps_avx(local_790,auVar146,0x7f);
            auVar76 = vdpps_avx(auVar2,auVar84,0x7f);
            auVar74 = vmulss_avx512f(auVar79,auVar83);
            auVar83 = vmulss_avx512f(auVar83,auVar83);
            auVar78 = vaddss_avx512f(auVar78,ZEXT416((uint)(auVar74._0_4_ * auVar83._0_4_)));
            auVar83 = vdpps_avx(auVar2,local_790,0x7f);
            auVar79 = vfnmadd231ss_avx512f(auVar76,local_780._0_16_,ZEXT416((uint)fVar170));
            auVar83 = vfnmadd231ss_avx512f(auVar83,local_780._0_16_,auVar73);
            auVar76 = vpermilps_avx(local_5a0._0_16_,0xff);
            fVar172 = fVar172 - auVar76._0_4_;
            auVar74 = vshufps_avx(auVar77,auVar77,0xff);
            auVar76 = vfmsub213ss_fma(auVar79,auVar78,auVar74);
            auVar239._0_8_ = auVar76._0_8_ ^ 0x8000000080000000;
            auVar239._8_4_ = auVar76._8_4_ ^ 0x80000000;
            auVar239._12_4_ = auVar76._12_4_ ^ 0x80000000;
            auVar83 = ZEXT416((uint)(auVar83._0_4_ * auVar78._0_4_));
            auVar78 = vfmsub231ss_fma(ZEXT416((uint)(auVar73._0_4_ * auVar76._0_4_)),
                                      ZEXT416((uint)fVar170),auVar83);
            auVar76 = vinsertps_avx(auVar239,auVar83,0x1c);
            auVar228._0_8_ = auVar73._0_8_ ^ 0x8000000080000000;
            auVar228._8_4_ = auVar73._8_4_ ^ 0x80000000;
            auVar228._12_4_ = auVar73._12_4_ ^ 0x80000000;
            auVar83 = vinsertps_avx(ZEXT416((uint)fVar170),auVar228,0x10);
            auVar209._0_4_ = auVar78._0_4_;
            auVar209._4_4_ = auVar209._0_4_;
            auVar209._8_4_ = auVar209._0_4_;
            auVar209._12_4_ = auVar209._0_4_;
            auVar73 = vdivps_avx(auVar76,auVar209);
            auVar76 = vdivps_avx(auVar83,auVar209);
            auVar83 = vbroadcastss_avx512vl(local_780._0_16_);
            auVar210._0_4_ = auVar83._0_4_ * auVar73._0_4_ + fVar172 * auVar76._0_4_;
            auVar210._4_4_ = auVar83._4_4_ * auVar73._4_4_ + fVar172 * auVar76._4_4_;
            auVar210._8_4_ = auVar83._8_4_ * auVar73._8_4_ + fVar172 * auVar76._8_4_;
            auVar210._12_4_ = auVar83._12_4_ * auVar73._12_4_ + fVar172 * auVar76._12_4_;
            auVar73 = vsubps_avx(local_740._0_16_,auVar210);
            auVar30._8_4_ = 0x7fffffff;
            auVar30._0_8_ = 0x7fffffff7fffffff;
            auVar30._12_4_ = 0x7fffffff;
            auVar76 = vandps_avx512vl(local_780._0_16_,auVar30);
            auVar76 = vucomiss_avx512f(auVar76);
            if (!(bool)uVar69 && !(bool)uVar70) {
              auVar76 = vaddss_avx512f(auVar80,auVar76);
              auVar76 = vfmadd231ss_fma(auVar76,local_6f0,ZEXT416(0x36000000));
              auVar31._8_4_ = 0x7fffffff;
              auVar31._0_8_ = 0x7fffffff7fffffff;
              auVar31._12_4_ = 0x7fffffff;
              auVar83 = vandps_avx512vl(ZEXT416((uint)fVar172),auVar31);
              if (auVar83._0_4_ < auVar76._0_4_) {
                bVar68 = uVar65 < 5;
                fVar155 = auVar73._0_4_ + (float)local_700._0_4_;
                auVar241 = ZEXT3264(local_820);
                auVar237 = ZEXT3264(local_860);
                auVar243 = ZEXT3264(local_880);
                if (fVar155 < fVar1) {
LAB_01a13001:
                  bVar64 = 0;
                  goto LAB_01a13009;
                }
                fVar168 = *(float *)(ray + k * 4 + 0x100);
                if (fVar155 <= fVar168) {
                  auVar76 = vmovshdup_avx(auVar73);
                  bVar64 = 0;
                  if ((auVar76._0_4_ < 0.0) || (1.0 < auVar76._0_4_)) goto LAB_01a13009;
                  auVar211._0_12_ = ZEXT812(0);
                  auVar211._12_4_ = 0;
                  auVar192._4_8_ = auVar211._4_8_;
                  auVar192._0_4_ = fVar169;
                  auVar192._12_4_ = 0;
                  auVar76 = vrsqrt14ss_avx512f(auVar211,auVar192);
                  fVar170 = auVar76._0_4_;
                  pGVar4 = (context->scene->geometries).items[uVar3].ptr;
                  if ((pGVar4->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) goto LAB_01a13001;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (bVar64 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                  goto LAB_01a13009;
                  fVar169 = fVar170 * 1.5 + fVar169 * -0.5 * fVar170 * fVar170 * fVar170;
                  auVar193._0_4_ = auVar2._0_4_ * fVar169;
                  auVar193._4_4_ = auVar2._4_4_ * fVar169;
                  auVar193._8_4_ = auVar2._8_4_ * fVar169;
                  auVar193._12_4_ = auVar2._12_4_ * fVar169;
                  auVar74 = vfmadd213ps_fma(auVar74,auVar193,auVar77);
                  auVar76 = vshufps_avx(auVar193,auVar193,0xc9);
                  auVar83 = vshufps_avx(auVar77,auVar77,0xc9);
                  auVar194._0_4_ = auVar193._0_4_ * auVar83._0_4_;
                  auVar194._4_4_ = auVar193._4_4_ * auVar83._4_4_;
                  auVar194._8_4_ = auVar193._8_4_ * auVar83._8_4_;
                  auVar194._12_4_ = auVar193._12_4_ * auVar83._12_4_;
                  auVar83 = vfmsub231ps_fma(auVar194,auVar77,auVar76);
                  auVar76 = vshufps_avx(auVar83,auVar83,0xc9);
                  auVar77 = vshufps_avx(auVar74,auVar74,0xc9);
                  auVar83 = vshufps_avx(auVar83,auVar83,0xd2);
                  auVar148._0_4_ = auVar74._0_4_ * auVar83._0_4_;
                  auVar148._4_4_ = auVar74._4_4_ * auVar83._4_4_;
                  auVar148._8_4_ = auVar74._8_4_ * auVar83._8_4_;
                  auVar148._12_4_ = auVar74._12_4_ * auVar83._12_4_;
                  auVar76 = vfmsub231ps_fma(auVar148,auVar76,auVar77);
                  auVar214._8_4_ = 1;
                  auVar214._0_8_ = 0x100000001;
                  auVar214._12_4_ = 1;
                  auVar214._16_4_ = 1;
                  auVar214._20_4_ = 1;
                  auVar214._24_4_ = 1;
                  auVar214._28_4_ = 1;
                  local_3a0 = vpermps_avx2(auVar214,ZEXT1632(auVar73));
                  auVar97 = vpermps_avx2(auVar214,ZEXT1632(auVar76));
                  auVar223._8_4_ = 2;
                  auVar223._0_8_ = 0x200000002;
                  auVar223._12_4_ = 2;
                  auVar223._16_4_ = 2;
                  auVar223._20_4_ = 2;
                  auVar223._24_4_ = 2;
                  auVar223._28_4_ = 2;
                  local_3e0 = vpermps_avx2(auVar223,ZEXT1632(auVar76));
                  local_3c0 = auVar76._0_4_;
                  local_400[0] = (RTCHitN)auVar97[0];
                  local_400[1] = (RTCHitN)auVar97[1];
                  local_400[2] = (RTCHitN)auVar97[2];
                  local_400[3] = (RTCHitN)auVar97[3];
                  local_400[4] = (RTCHitN)auVar97[4];
                  local_400[5] = (RTCHitN)auVar97[5];
                  local_400[6] = (RTCHitN)auVar97[6];
                  local_400[7] = (RTCHitN)auVar97[7];
                  local_400[8] = (RTCHitN)auVar97[8];
                  local_400[9] = (RTCHitN)auVar97[9];
                  local_400[10] = (RTCHitN)auVar97[10];
                  local_400[0xb] = (RTCHitN)auVar97[0xb];
                  local_400[0xc] = (RTCHitN)auVar97[0xc];
                  local_400[0xd] = (RTCHitN)auVar97[0xd];
                  local_400[0xe] = (RTCHitN)auVar97[0xe];
                  local_400[0xf] = (RTCHitN)auVar97[0xf];
                  local_400[0x10] = (RTCHitN)auVar97[0x10];
                  local_400[0x11] = (RTCHitN)auVar97[0x11];
                  local_400[0x12] = (RTCHitN)auVar97[0x12];
                  local_400[0x13] = (RTCHitN)auVar97[0x13];
                  local_400[0x14] = (RTCHitN)auVar97[0x14];
                  local_400[0x15] = (RTCHitN)auVar97[0x15];
                  local_400[0x16] = (RTCHitN)auVar97[0x16];
                  local_400[0x17] = (RTCHitN)auVar97[0x17];
                  local_400[0x18] = (RTCHitN)auVar97[0x18];
                  local_400[0x19] = (RTCHitN)auVar97[0x19];
                  local_400[0x1a] = (RTCHitN)auVar97[0x1a];
                  local_400[0x1b] = (RTCHitN)auVar97[0x1b];
                  local_400[0x1c] = (RTCHitN)auVar97[0x1c];
                  local_400[0x1d] = (RTCHitN)auVar97[0x1d];
                  local_400[0x1e] = (RTCHitN)auVar97[0x1e];
                  local_400[0x1f] = (RTCHitN)auVar97[0x1f];
                  uStack_3bc = local_3c0;
                  uStack_3b8 = local_3c0;
                  uStack_3b4 = local_3c0;
                  uStack_3b0 = local_3c0;
                  uStack_3ac = local_3c0;
                  uStack_3a8 = local_3c0;
                  uStack_3a4 = local_3c0;
                  local_380 = ZEXT432(0) << 0x20;
                  local_360 = local_420._0_8_;
                  uStack_358 = local_420._8_8_;
                  uStack_350 = local_420._16_8_;
                  uStack_348 = local_420._24_8_;
                  local_340 = local_440;
                  vpcmpeqd_avx2(local_440,local_440);
                  local_320 = context->user->instID[0];
                  uStack_31c = local_320;
                  uStack_318 = local_320;
                  uStack_314 = local_320;
                  uStack_310 = local_320;
                  uStack_30c = local_320;
                  uStack_308 = local_320;
                  uStack_304 = local_320;
                  local_300 = context->user->instPrimID[0];
                  uStack_2fc = local_300;
                  uStack_2f8 = local_300;
                  uStack_2f4 = local_300;
                  uStack_2f0 = local_300;
                  uStack_2ec = local_300;
                  uStack_2e8 = local_300;
                  uStack_2e4 = local_300;
                  *(float *)(ray + k * 4 + 0x100) = fVar155;
                  local_720 = local_480;
                  local_8b0.valid = (int *)local_720;
                  local_8b0.geometryUserPtr = pGVar4->userPtr;
                  local_8b0.context = context->user;
                  local_8b0.hit = local_400;
                  local_8b0.N = 8;
                  local_8b0.ray = (RTCRayN *)ray;
                  if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar255 = ZEXT1664(auVar2);
                    (*pGVar4->occlusionFilterN)(&local_8b0);
                    auVar243 = ZEXT3264(local_880);
                    auVar237 = ZEXT3264(local_860);
                    auVar246 = ZEXT3264(local_840);
                    auVar241 = ZEXT3264(local_820);
                    auVar252 = ZEXT3264(local_800);
                    auVar249 = ZEXT3264(local_7e0);
                    auVar256 = ZEXT3264(local_7c0);
                  }
                  if (local_720 != (undefined1  [32])0x0) {
                    p_Var6 = context->args->filter;
                    if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar255 = ZEXT1664(auVar255._0_16_);
                      (*p_Var6)(&local_8b0);
                      auVar243 = ZEXT3264(local_880);
                      auVar237 = ZEXT3264(local_860);
                      auVar246 = ZEXT3264(local_840);
                      auVar241 = ZEXT3264(local_820);
                      auVar252 = ZEXT3264(local_800);
                      auVar249 = ZEXT3264(local_7e0);
                      auVar256 = ZEXT3264(local_7c0);
                    }
                    uVar71 = vptestmd_avx512vl(local_720,local_720);
                    auVar97 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                    bVar7 = (bool)((byte)uVar71 & 1);
                    bVar8 = (bool)((byte)(uVar71 >> 1) & 1);
                    bVar9 = (bool)((byte)(uVar71 >> 2) & 1);
                    bVar10 = (bool)((byte)(uVar71 >> 3) & 1);
                    bVar11 = (bool)((byte)(uVar71 >> 4) & 1);
                    bVar12 = (bool)((byte)(uVar71 >> 5) & 1);
                    bVar13 = (bool)((byte)(uVar71 >> 6) & 1);
                    bVar14 = SUB81(uVar71 >> 7,0);
                    *(uint *)(local_8b0.ray + 0x100) =
                         (uint)bVar7 * auVar97._0_4_ |
                         (uint)!bVar7 * *(int *)(local_8b0.ray + 0x100);
                    *(uint *)(local_8b0.ray + 0x104) =
                         (uint)bVar8 * auVar97._4_4_ |
                         (uint)!bVar8 * *(int *)(local_8b0.ray + 0x104);
                    *(uint *)(local_8b0.ray + 0x108) =
                         (uint)bVar9 * auVar97._8_4_ |
                         (uint)!bVar9 * *(int *)(local_8b0.ray + 0x108);
                    *(uint *)(local_8b0.ray + 0x10c) =
                         (uint)bVar10 * auVar97._12_4_ |
                         (uint)!bVar10 * *(int *)(local_8b0.ray + 0x10c);
                    *(uint *)(local_8b0.ray + 0x110) =
                         (uint)bVar11 * auVar97._16_4_ |
                         (uint)!bVar11 * *(int *)(local_8b0.ray + 0x110);
                    *(uint *)(local_8b0.ray + 0x114) =
                         (uint)bVar12 * auVar97._20_4_ |
                         (uint)!bVar12 * *(int *)(local_8b0.ray + 0x114);
                    *(uint *)(local_8b0.ray + 0x118) =
                         (uint)bVar13 * auVar97._24_4_ |
                         (uint)!bVar13 * *(int *)(local_8b0.ray + 0x118);
                    *(uint *)(local_8b0.ray + 0x11c) =
                         (uint)bVar14 * auVar97._28_4_ |
                         (uint)!bVar14 * *(int *)(local_8b0.ray + 0x11c);
                    bVar64 = 1;
                    if (local_720 != (undefined1  [32])0x0) goto LAB_01a13009;
                  }
                  *(float *)(ray + k * 4 + 0x100) = fVar168;
                }
                bVar64 = 0;
                goto LAB_01a13009;
              }
            }
            uVar65 = uVar65 + 1;
            auVar241 = ZEXT3264(local_820);
            auVar237 = ZEXT3264(local_860);
            auVar243 = ZEXT3264(local_880);
          }
          bVar68 = false;
LAB_01a13009:
          bVar61 = bVar61 | bVar68 & bVar64;
          uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar231._4_4_ = uVar156;
          auVar231._0_4_ = uVar156;
          auVar231._8_4_ = uVar156;
          auVar231._12_4_ = uVar156;
          auVar231._16_4_ = uVar156;
          auVar231._20_4_ = uVar156;
          auVar231._24_4_ = uVar156;
          auVar231._28_4_ = uVar156;
          auVar232 = ZEXT3264(auVar231);
          auVar55._4_4_ = fStack_4bc;
          auVar55._0_4_ = local_4c0;
          auVar55._8_4_ = fStack_4b8;
          auVar55._12_4_ = fStack_4b4;
          auVar55._16_4_ = fStack_4b0;
          auVar55._20_4_ = fStack_4ac;
          auVar55._24_4_ = fStack_4a8;
          auVar55._28_4_ = fStack_4a4;
          uVar17 = vcmpps_avx512vl(auVar231,auVar55,0xd);
        }
        uVar19 = vpcmpd_avx512vl(local_460,local_2a0,1);
        uVar18 = vpcmpd_avx512vl(local_460,_local_4e0,1);
        auVar167._0_4_ = (float)local_500._0_4_ + (float)local_1c0._0_4_;
        auVar167._4_4_ = (float)local_500._4_4_ + (float)local_1c0._4_4_;
        auVar167._8_4_ = fStack_4f8 + fStack_1b8;
        auVar167._12_4_ = fStack_4f4 + fStack_1b4;
        auVar167._16_4_ = fStack_4f0 + fStack_1b0;
        auVar167._20_4_ = fStack_4ec + fStack_1ac;
        auVar167._24_4_ = fStack_4e8 + fStack_1a8;
        auVar167._28_4_ = fStack_4e4 + fStack_1a4;
        uVar156 = auVar232._0_4_;
        auVar198._4_4_ = uVar156;
        auVar198._0_4_ = uVar156;
        auVar198._8_4_ = uVar156;
        auVar198._12_4_ = uVar156;
        auVar198._16_4_ = uVar156;
        auVar198._20_4_ = uVar156;
        auVar198._24_4_ = uVar156;
        auVar198._28_4_ = uVar156;
        uVar17 = vcmpps_avx512vl(auVar167,auVar198,2);
        bVar63 = bVar63 & (byte)uVar19 & (byte)uVar17;
        auVar215._0_4_ = (float)local_500._0_4_ + (float)local_2e0._0_4_;
        auVar215._4_4_ = (float)local_500._4_4_ + (float)local_2e0._4_4_;
        auVar215._8_4_ = fStack_4f8 + fStack_2d8;
        auVar215._12_4_ = fStack_4f4 + fStack_2d4;
        auVar215._16_4_ = fStack_4f0 + fStack_2d0;
        auVar215._20_4_ = fStack_4ec + fStack_2cc;
        auVar215._24_4_ = fStack_4e8 + fStack_2c8;
        auVar215._28_4_ = fStack_4e4 + fStack_2c4;
        uVar17 = vcmpps_avx512vl(auVar215,auVar198,2);
        bVar58 = bVar58 & (byte)uVar18 & (byte)uVar17 | bVar63;
        if (bVar58 != 0) {
          abStack_180[uVar62 * 0x60] = bVar58;
          bVar68 = (bool)(bVar63 >> 1 & 1);
          bVar7 = (bool)(bVar63 >> 2 & 1);
          bVar8 = (bool)(bVar63 >> 3 & 1);
          bVar9 = (bool)(bVar63 >> 4 & 1);
          bVar10 = (bool)(bVar63 >> 5 & 1);
          auStack_160[uVar62 * 0x18] =
               (uint)(bVar63 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar63 & 1) * local_2e0._0_4_;
          auStack_160[uVar62 * 0x18 + 1] =
               (uint)bVar68 * local_1c0._4_4_ | (uint)!bVar68 * local_2e0._4_4_;
          auStack_160[uVar62 * 0x18 + 2] =
               (uint)bVar7 * (int)fStack_1b8 | (uint)!bVar7 * (int)fStack_2d8;
          auStack_160[uVar62 * 0x18 + 3] =
               (uint)bVar8 * (int)fStack_1b4 | (uint)!bVar8 * (int)fStack_2d4;
          auStack_160[uVar62 * 0x18 + 4] =
               (uint)bVar9 * (int)fStack_1b0 | (uint)!bVar9 * (int)fStack_2d0;
          auStack_160[uVar62 * 0x18 + 5] =
               (uint)bVar10 * (int)fStack_1ac | (uint)!bVar10 * (int)fStack_2cc;
          auStack_160[uVar62 * 0x18 + 6] =
               (uint)(bVar63 >> 6) * (int)fStack_1a8 | (uint)!(bool)(bVar63 >> 6) * (int)fStack_2c8;
          (&fStack_144)[uVar62 * 0x18] = fStack_2c4;
          uVar71 = vmovlps_avx(local_490);
          (&uStack_140)[uVar62 * 0xc] = uVar71;
          aiStack_138[uVar62 * 0x18] = local_ab4 + 1;
          uVar62 = (ulong)((int)uVar62 + 1);
        }
        auVar97 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar258 = ZEXT3264(auVar97);
        auVar232 = ZEXT3264(_DAT_01f7b040);
      }
    }
    do {
      uVar72 = (uint)uVar62;
      uVar62 = (ulong)(uVar72 - 1);
      if (uVar72 == 0) {
        if (bVar61 != 0) goto LAB_01a135e2;
        uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar37._4_4_ = uVar156;
        auVar37._0_4_ = uVar156;
        auVar37._8_4_ = uVar156;
        auVar37._12_4_ = uVar156;
        auVar37._16_4_ = uVar156;
        auVar37._20_4_ = uVar156;
        auVar37._24_4_ = uVar156;
        auVar37._28_4_ = uVar156;
        uVar17 = vcmpps_avx512vl(local_280,auVar37,2);
        uVar67 = (ulong)((uint)uVar17 & (uint)uVar67 - 1 & (uint)uVar67);
        goto LAB_01a10d85;
      }
      auVar97 = *(undefined1 (*) [32])(auStack_160 + uVar62 * 0x18);
      auVar164._0_4_ = auVar97._0_4_ + (float)local_500._0_4_;
      auVar164._4_4_ = auVar97._4_4_ + (float)local_500._4_4_;
      auVar164._8_4_ = auVar97._8_4_ + fStack_4f8;
      auVar164._12_4_ = auVar97._12_4_ + fStack_4f4;
      auVar164._16_4_ = auVar97._16_4_ + fStack_4f0;
      auVar164._20_4_ = auVar97._20_4_ + fStack_4ec;
      auVar164._24_4_ = auVar97._24_4_ + fStack_4e8;
      auVar164._28_4_ = auVar97._28_4_ + fStack_4e4;
      uVar156 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar36._4_4_ = uVar156;
      auVar36._0_4_ = uVar156;
      auVar36._8_4_ = uVar156;
      auVar36._12_4_ = uVar156;
      auVar36._16_4_ = uVar156;
      auVar36._20_4_ = uVar156;
      auVar36._24_4_ = uVar156;
      auVar36._28_4_ = uVar156;
      uVar17 = vcmpps_avx512vl(auVar164,auVar36,2);
      uVar134 = (uint)uVar17 & (uint)abStack_180[uVar62 * 0x60];
    } while (uVar134 == 0);
    uVar71 = (&uStack_140)[uVar62 * 0xc];
    auVar157._8_8_ = 0;
    auVar157._0_8_ = uVar71;
    auVar197._8_4_ = 0x7f800000;
    auVar197._0_8_ = 0x7f8000007f800000;
    auVar197._12_4_ = 0x7f800000;
    auVar197._16_4_ = 0x7f800000;
    auVar197._20_4_ = 0x7f800000;
    auVar197._24_4_ = 0x7f800000;
    auVar197._28_4_ = 0x7f800000;
    auVar98 = vblendmps_avx512vl(auVar197,auVar97);
    bVar58 = (byte)uVar134;
    auVar129._0_4_ =
         (uint)(bVar58 & 1) * auVar98._0_4_ | (uint)!(bool)(bVar58 & 1) * (int)auVar97._0_4_;
    bVar68 = (bool)((byte)(uVar134 >> 1) & 1);
    auVar129._4_4_ = (uint)bVar68 * auVar98._4_4_ | (uint)!bVar68 * (int)auVar97._4_4_;
    bVar68 = (bool)((byte)(uVar134 >> 2) & 1);
    auVar129._8_4_ = (uint)bVar68 * auVar98._8_4_ | (uint)!bVar68 * (int)auVar97._8_4_;
    bVar68 = (bool)((byte)(uVar134 >> 3) & 1);
    auVar129._12_4_ = (uint)bVar68 * auVar98._12_4_ | (uint)!bVar68 * (int)auVar97._12_4_;
    bVar68 = (bool)((byte)(uVar134 >> 4) & 1);
    auVar129._16_4_ = (uint)bVar68 * auVar98._16_4_ | (uint)!bVar68 * (int)auVar97._16_4_;
    bVar68 = (bool)((byte)(uVar134 >> 5) & 1);
    auVar129._20_4_ = (uint)bVar68 * auVar98._20_4_ | (uint)!bVar68 * (int)auVar97._20_4_;
    bVar68 = (bool)((byte)(uVar134 >> 6) & 1);
    auVar129._24_4_ = (uint)bVar68 * auVar98._24_4_ | (uint)!bVar68 * (int)auVar97._24_4_;
    auVar129._28_4_ =
         (uVar134 >> 7) * auVar98._28_4_ | (uint)!SUB41(uVar134 >> 7,0) * (int)auVar97._28_4_;
    auVar97 = vshufps_avx(auVar129,auVar129,0xb1);
    auVar97 = vminps_avx(auVar129,auVar97);
    auVar98 = vshufpd_avx(auVar97,auVar97,5);
    auVar97 = vminps_avx(auVar97,auVar98);
    auVar98 = vpermpd_avx2(auVar97,0x4e);
    auVar97 = vminps_avx(auVar97,auVar98);
    uVar17 = vcmpps_avx512vl(auVar129,auVar97,0);
    bVar66 = (byte)uVar17 & bVar58;
    if (bVar66 != 0) {
      uVar134 = (uint)bVar66;
    }
    uVar135 = 0;
    for (; (uVar134 & 1) == 0; uVar134 = uVar134 >> 1 | 0x80000000) {
      uVar135 = uVar135 + 1;
    }
    local_ab4 = aiStack_138[uVar62 * 0x18];
    bVar58 = ~('\x01' << ((byte)uVar135 & 0x1f)) & bVar58;
    abStack_180[uVar62 * 0x60] = bVar58;
    if (bVar58 == 0) {
      uVar72 = uVar72 - 1;
    }
    uVar156 = (undefined4)uVar71;
    auVar149._4_4_ = uVar156;
    auVar149._0_4_ = uVar156;
    auVar149._8_4_ = uVar156;
    auVar149._12_4_ = uVar156;
    auVar149._16_4_ = uVar156;
    auVar149._20_4_ = uVar156;
    auVar149._24_4_ = uVar156;
    auVar149._28_4_ = uVar156;
    auVar73 = vmovshdup_avx(auVar157);
    auVar73 = vsubps_avx(auVar73,auVar157);
    auVar165._0_4_ = auVar73._0_4_;
    auVar165._4_4_ = auVar165._0_4_;
    auVar165._8_4_ = auVar165._0_4_;
    auVar165._12_4_ = auVar165._0_4_;
    auVar165._16_4_ = auVar165._0_4_;
    auVar165._20_4_ = auVar165._0_4_;
    auVar165._24_4_ = auVar165._0_4_;
    auVar165._28_4_ = auVar165._0_4_;
    auVar73 = vfmadd132ps_fma(auVar165,auVar149,auVar232._0_32_);
    auVar97 = ZEXT1632(auVar73);
    local_400[0] = (RTCHitN)auVar97[0];
    local_400[1] = (RTCHitN)auVar97[1];
    local_400[2] = (RTCHitN)auVar97[2];
    local_400[3] = (RTCHitN)auVar97[3];
    local_400[4] = (RTCHitN)auVar97[4];
    local_400[5] = (RTCHitN)auVar97[5];
    local_400[6] = (RTCHitN)auVar97[6];
    local_400[7] = (RTCHitN)auVar97[7];
    local_400[8] = (RTCHitN)auVar97[8];
    local_400[9] = (RTCHitN)auVar97[9];
    local_400[10] = (RTCHitN)auVar97[10];
    local_400[0xb] = (RTCHitN)auVar97[0xb];
    local_400[0xc] = (RTCHitN)auVar97[0xc];
    local_400[0xd] = (RTCHitN)auVar97[0xd];
    local_400[0xe] = (RTCHitN)auVar97[0xe];
    local_400[0xf] = (RTCHitN)auVar97[0xf];
    local_400[0x10] = (RTCHitN)auVar97[0x10];
    local_400[0x11] = (RTCHitN)auVar97[0x11];
    local_400[0x12] = (RTCHitN)auVar97[0x12];
    local_400[0x13] = (RTCHitN)auVar97[0x13];
    local_400[0x14] = (RTCHitN)auVar97[0x14];
    local_400[0x15] = (RTCHitN)auVar97[0x15];
    local_400[0x16] = (RTCHitN)auVar97[0x16];
    local_400[0x17] = (RTCHitN)auVar97[0x17];
    local_400[0x18] = (RTCHitN)auVar97[0x18];
    local_400[0x19] = (RTCHitN)auVar97[0x19];
    local_400[0x1a] = (RTCHitN)auVar97[0x1a];
    local_400[0x1b] = (RTCHitN)auVar97[0x1b];
    local_400[0x1c] = (RTCHitN)auVar97[0x1c];
    local_400[0x1d] = (RTCHitN)auVar97[0x1d];
    local_400[0x1e] = (RTCHitN)auVar97[0x1e];
    local_400[0x1f] = (RTCHitN)auVar97[0x1f];
    local_490._8_8_ = 0;
    local_490._0_8_ = *(ulong *)(local_400 + (ulong)uVar135 * 4);
    uVar62 = (ulong)uVar72;
  } while( true );
}

Assistant:

static __forceinline bool occluded_h(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID));
          if (Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }